

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O0

void fdct8x16_new_sse2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined8 uVar137;
  undefined8 uVar138;
  undefined8 uVar139;
  undefined8 uVar140;
  undefined8 uVar141;
  undefined8 uVar142;
  undefined8 uVar143;
  undefined8 uVar144;
  int iVar145;
  uint uVar146;
  undefined4 uVar147;
  int iVar148;
  int iVar149;
  uint uVar150;
  uint uVar151;
  uint uVar152;
  uint uVar153;
  uint uVar154;
  uint uVar155;
  uint uVar156;
  uint uVar157;
  uint uVar158;
  uint uVar159;
  uint uVar160;
  int32_t *piVar161;
  char in_DL;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  __m128i d1_12;
  __m128i d0_12;
  __m128i c1_12;
  __m128i c0_12;
  __m128i b1_12;
  __m128i b0_12;
  __m128i a1_12;
  __m128i a0_12;
  __m128i v1_12;
  __m128i v0_12;
  __m128i u1_12;
  __m128i u0_12;
  __m128i t1_12;
  __m128i t0_12;
  __m128i d1_11;
  __m128i d0_11;
  __m128i c1_11;
  __m128i c0_11;
  __m128i b1_11;
  __m128i b0_11;
  __m128i a1_11;
  __m128i a0_11;
  __m128i v1_11;
  __m128i v0_11;
  __m128i u1_11;
  __m128i u0_11;
  __m128i t1_11;
  __m128i t0_11;
  __m128i d1_10;
  __m128i d0_10;
  __m128i c1_10;
  __m128i c0_10;
  __m128i b1_10;
  __m128i b0_10;
  __m128i a1_10;
  __m128i a0_10;
  __m128i v1_10;
  __m128i v0_10;
  __m128i u1_10;
  __m128i u0_10;
  __m128i t1_10;
  __m128i t0_10;
  __m128i d1_9;
  __m128i d0_9;
  __m128i c1_9;
  __m128i c0_9;
  __m128i b1_9;
  __m128i b0_9;
  __m128i a1_9;
  __m128i a0_9;
  __m128i v1_9;
  __m128i v0_9;
  __m128i u1_9;
  __m128i u0_9;
  __m128i t1_9;
  __m128i t0_9;
  __m128i x6 [16];
  __m128i d1_8;
  __m128i d0_8;
  __m128i c1_8;
  __m128i c0_8;
  __m128i b1_8;
  __m128i b0_8;
  __m128i a1_8;
  __m128i a0_8;
  __m128i v1_8;
  __m128i v0_8;
  __m128i u1_8;
  __m128i u0_8;
  __m128i t1_8;
  __m128i t0_8;
  __m128i d1_7;
  __m128i d0_7;
  __m128i c1_7;
  __m128i c0_7;
  __m128i b1_7;
  __m128i b0_7;
  __m128i a1_7;
  __m128i a0_7;
  __m128i v1_7;
  __m128i v0_7;
  __m128i u1_7;
  __m128i u0_7;
  __m128i t1_7;
  __m128i t0_7;
  __m128i x5 [16];
  __m128i d1_6;
  __m128i d0_6;
  __m128i c1_6;
  __m128i c0_6;
  __m128i b1_6;
  __m128i b0_6;
  __m128i a1_6;
  __m128i a0_6;
  __m128i v1_6;
  __m128i v0_6;
  __m128i u1_6;
  __m128i u0_6;
  __m128i t1_6;
  __m128i t0_6;
  __m128i d1_5;
  __m128i d0_5;
  __m128i c1_5;
  __m128i c0_5;
  __m128i b1_5;
  __m128i b0_5;
  __m128i a1_5;
  __m128i a0_5;
  __m128i v1_5;
  __m128i v0_5;
  __m128i u1_5;
  __m128i u0_5;
  __m128i t1_5;
  __m128i t0_5;
  __m128i d1_4;
  __m128i d0_4;
  __m128i c1_4;
  __m128i c0_4;
  __m128i b1_4;
  __m128i b0_4;
  __m128i a1_4;
  __m128i a0_4;
  __m128i v1_4;
  __m128i v0_4;
  __m128i u1_4;
  __m128i u0_4;
  __m128i t1_4;
  __m128i t0_4;
  __m128i d1_3;
  __m128i d0_3;
  __m128i c1_3;
  __m128i c0_3;
  __m128i b1_3;
  __m128i b0_3;
  __m128i a1_3;
  __m128i a0_3;
  __m128i v1_3;
  __m128i v0_3;
  __m128i u1_3;
  __m128i u0_3;
  __m128i t1_3;
  __m128i t0_3;
  __m128i x4 [16];
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i x3 [16];
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i x2 [16];
  __m128i x1 [16];
  __m128i cospi_m52_p12;
  __m128i cospi_p12_p52;
  __m128i cospi_m20_p44;
  __m128i cospi_p44_p20;
  __m128i cospi_m36_p28;
  __m128i cospi_p28_p36;
  __m128i cospi_m04_p60;
  __m128i cospi_p60_p04;
  __m128i cospi_m40_p24;
  __m128i cospi_p24_p40;
  __m128i cospi_m08_p56;
  __m128i cospi_p56_p08;
  __m128i cospi_m48_m16;
  __m128i cospi_m16_p48;
  __m128i cospi_p48_p16;
  __m128i cospi_p32_m32;
  __m128i cospi_p32_p32;
  __m128i cospi_m32_p32;
  __m128i __rounding;
  int32_t *cospi;
  undefined8 local_3168;
  undefined8 uStack_3160;
  undefined8 local_3158;
  undefined8 uStack_3150;
  undefined8 local_3148;
  undefined8 uStack_3140;
  undefined8 local_3138;
  undefined8 uStack_3130;
  undefined8 local_3128;
  undefined8 uStack_3120;
  undefined8 local_3118;
  undefined8 uStack_3110;
  undefined8 local_3108;
  undefined8 uStack_3100;
  undefined8 local_30f8;
  undefined8 uStack_30f0;
  undefined8 local_2ee8;
  undefined8 uStack_2ee0;
  undefined8 local_2ed8;
  undefined8 uStack_2ed0;
  undefined8 local_2ec8;
  undefined8 uStack_2ec0;
  undefined8 local_2eb8;
  undefined8 uStack_2eb0;
  undefined8 local_2aa8;
  undefined8 uStack_2aa0;
  undefined8 local_2a98;
  undefined8 uStack_2a90;
  undefined8 local_2a88;
  undefined8 uStack_2a80;
  undefined8 local_2a78;
  undefined8 uStack_2a70;
  undefined2 local_1c68;
  undefined2 uStack_1c66;
  undefined2 uStack_1c64;
  undefined2 uStack_1c62;
  undefined2 local_1c58;
  undefined2 uStack_1c56;
  undefined2 uStack_1c54;
  undefined2 uStack_1c52;
  undefined2 local_1c48;
  undefined2 uStack_1c46;
  undefined2 uStack_1c44;
  undefined2 uStack_1c42;
  undefined2 local_1c38;
  undefined2 uStack_1c36;
  undefined2 uStack_1c34;
  undefined2 uStack_1c32;
  undefined2 local_1c28;
  undefined2 uStack_1c26;
  undefined2 uStack_1c24;
  undefined2 uStack_1c22;
  undefined2 local_1c18;
  undefined2 uStack_1c16;
  undefined2 uStack_1c14;
  undefined2 uStack_1c12;
  undefined2 local_1c08;
  undefined2 uStack_1c06;
  undefined2 uStack_1c04;
  undefined2 uStack_1c02;
  undefined2 local_1bf8;
  undefined2 uStack_1bf6;
  undefined2 uStack_1bf4;
  undefined2 uStack_1bf2;
  undefined2 local_1be8;
  undefined2 uStack_1be6;
  undefined2 uStack_1be4;
  undefined2 uStack_1be2;
  undefined2 local_1bd8;
  undefined2 uStack_1bd6;
  undefined2 uStack_1bd4;
  undefined2 uStack_1bd2;
  undefined2 local_1bc8;
  undefined2 uStack_1bc6;
  undefined2 uStack_1bc4;
  undefined2 uStack_1bc2;
  undefined2 local_1bb8;
  undefined2 uStack_1bb6;
  undefined2 uStack_1bb4;
  undefined2 uStack_1bb2;
  undefined2 local_1ba8;
  undefined2 uStack_1ba6;
  undefined2 uStack_1ba4;
  undefined2 uStack_1ba2;
  undefined2 local_1b98;
  undefined2 uStack_1b96;
  undefined2 uStack_1b94;
  undefined2 uStack_1b92;
  undefined2 local_1b88;
  undefined2 uStack_1b86;
  undefined2 uStack_1b84;
  undefined2 uStack_1b82;
  undefined2 local_1b78;
  undefined2 uStack_1b76;
  undefined2 uStack_1b74;
  undefined2 uStack_1b72;
  undefined2 local_1b68;
  undefined2 uStack_1b66;
  undefined2 uStack_1b64;
  undefined2 uStack_1b62;
  undefined2 local_1b58;
  undefined2 uStack_1b56;
  undefined2 uStack_1b54;
  undefined2 uStack_1b52;
  undefined2 local_1b48;
  undefined2 uStack_1b46;
  undefined2 uStack_1b44;
  undefined2 uStack_1b42;
  undefined2 local_1b38;
  undefined2 uStack_1b36;
  undefined2 uStack_1b34;
  undefined2 uStack_1b32;
  undefined2 local_1b28;
  undefined2 uStack_1b26;
  undefined2 uStack_1b24;
  undefined2 uStack_1b22;
  undefined2 local_1b18;
  undefined2 uStack_1b16;
  undefined2 uStack_1b14;
  undefined2 uStack_1b12;
  undefined2 local_1b08;
  undefined2 uStack_1b06;
  undefined2 uStack_1b04;
  undefined2 uStack_1b02;
  undefined2 local_1af8;
  undefined2 uStack_1af6;
  undefined2 uStack_1af4;
  undefined2 uStack_1af2;
  undefined2 local_1ae8;
  undefined2 uStack_1ae6;
  undefined2 uStack_1ae4;
  undefined2 uStack_1ae2;
  undefined2 local_1ad8;
  undefined2 uStack_1ad6;
  undefined2 uStack_1ad4;
  undefined2 uStack_1ad2;
  undefined2 uStack_1ac0;
  undefined2 uStack_1abe;
  undefined2 uStack_1abc;
  undefined2 uStack_1aba;
  undefined2 uStack_1ab0;
  undefined2 uStack_1aae;
  undefined2 uStack_1aac;
  undefined2 uStack_1aaa;
  undefined2 uStack_1aa0;
  undefined2 uStack_1a9e;
  undefined2 uStack_1a9c;
  undefined2 uStack_1a9a;
  undefined2 uStack_1a90;
  undefined2 uStack_1a8e;
  undefined2 uStack_1a8c;
  undefined2 uStack_1a8a;
  undefined2 uStack_1a80;
  undefined2 uStack_1a7e;
  undefined2 uStack_1a7c;
  undefined2 uStack_1a7a;
  undefined2 uStack_1a70;
  undefined2 uStack_1a6e;
  undefined2 uStack_1a6c;
  undefined2 uStack_1a6a;
  undefined2 uStack_1a60;
  undefined2 uStack_1a5e;
  undefined2 uStack_1a5c;
  undefined2 uStack_1a5a;
  undefined2 uStack_1a50;
  undefined2 uStack_1a4e;
  undefined2 uStack_1a4c;
  undefined2 uStack_1a4a;
  undefined2 uStack_1a40;
  undefined2 uStack_1a3e;
  undefined2 uStack_1a3c;
  undefined2 uStack_1a3a;
  undefined2 uStack_1a30;
  undefined2 uStack_1a2e;
  undefined2 uStack_1a2c;
  undefined2 uStack_1a2a;
  undefined2 uStack_1a20;
  undefined2 uStack_1a1e;
  undefined2 uStack_1a1c;
  undefined2 uStack_1a1a;
  undefined2 uStack_1a10;
  undefined2 uStack_1a0e;
  undefined2 uStack_1a0c;
  undefined2 uStack_1a0a;
  undefined2 uStack_1a00;
  undefined2 uStack_19fe;
  undefined2 uStack_19fc;
  undefined2 uStack_19fa;
  undefined2 uStack_19f0;
  undefined2 uStack_19ee;
  undefined2 uStack_19ec;
  undefined2 uStack_19ea;
  undefined2 uStack_19e0;
  undefined2 uStack_19de;
  undefined2 uStack_19dc;
  undefined2 uStack_19da;
  undefined2 uStack_19d0;
  undefined2 uStack_19ce;
  undefined2 uStack_19cc;
  undefined2 uStack_19ca;
  undefined2 uStack_19c0;
  undefined2 uStack_19be;
  undefined2 uStack_19bc;
  undefined2 uStack_19ba;
  undefined2 uStack_19b0;
  undefined2 uStack_19ae;
  undefined2 uStack_19ac;
  undefined2 uStack_19aa;
  undefined2 uStack_19a0;
  undefined2 uStack_199e;
  undefined2 uStack_199c;
  undefined2 uStack_199a;
  undefined2 uStack_1990;
  undefined2 uStack_198e;
  undefined2 uStack_198c;
  undefined2 uStack_198a;
  undefined2 uStack_1980;
  undefined2 uStack_197e;
  undefined2 uStack_197c;
  undefined2 uStack_197a;
  undefined2 uStack_1970;
  undefined2 uStack_196e;
  undefined2 uStack_196c;
  undefined2 uStack_196a;
  undefined2 uStack_1960;
  undefined2 uStack_195e;
  undefined2 uStack_195c;
  undefined2 uStack_195a;
  undefined2 uStack_1950;
  undefined2 uStack_194e;
  undefined2 uStack_194c;
  undefined2 uStack_194a;
  undefined2 uStack_1940;
  undefined2 uStack_193e;
  undefined2 uStack_193c;
  undefined2 uStack_193a;
  undefined2 uStack_1930;
  undefined2 uStack_192e;
  undefined2 uStack_192c;
  undefined2 uStack_192a;
  int local_1298;
  int iStack_1294;
  int iStack_1290;
  int iStack_128c;
  int local_1278;
  int iStack_1274;
  int iStack_1270;
  int iStack_126c;
  int local_1258;
  int iStack_1254;
  int iStack_1250;
  int iStack_124c;
  int local_1238;
  int iStack_1234;
  int iStack_1230;
  int iStack_122c;
  int local_1218;
  int iStack_1214;
  int iStack_1210;
  int iStack_120c;
  int local_11f8;
  int iStack_11f4;
  int iStack_11f0;
  int iStack_11ec;
  int local_11d8;
  int iStack_11d4;
  int iStack_11d0;
  int iStack_11cc;
  int local_11b8;
  int iStack_11b4;
  int iStack_11b0;
  int iStack_11ac;
  int local_1198;
  int iStack_1194;
  int iStack_1190;
  int iStack_118c;
  int local_1178;
  int iStack_1174;
  int iStack_1170;
  int iStack_116c;
  int local_1158;
  int iStack_1154;
  int iStack_1150;
  int iStack_114c;
  int local_1138;
  int iStack_1134;
  int iStack_1130;
  int iStack_112c;
  int local_1118;
  int iStack_1114;
  int iStack_1110;
  int iStack_110c;
  int local_10f8;
  int iStack_10f4;
  int iStack_10f0;
  int iStack_10ec;
  int local_10d8;
  int iStack_10d4;
  int iStack_10d0;
  int iStack_10cc;
  int local_10b8;
  int iStack_10b4;
  int iStack_10b0;
  int iStack_10ac;
  int local_1098;
  int iStack_1094;
  int iStack_1090;
  int iStack_108c;
  int local_1078;
  int iStack_1074;
  int iStack_1070;
  int iStack_106c;
  int local_1058;
  int iStack_1054;
  int iStack_1050;
  int iStack_104c;
  int local_1038;
  int iStack_1034;
  int iStack_1030;
  int iStack_102c;
  int local_1018;
  int iStack_1014;
  int iStack_1010;
  int iStack_100c;
  int local_ff8;
  int iStack_ff4;
  int iStack_ff0;
  int iStack_fec;
  int local_fd8;
  int iStack_fd4;
  int iStack_fd0;
  int iStack_fcc;
  int local_fb8;
  int iStack_fb4;
  int iStack_fb0;
  int iStack_fac;
  int local_f98;
  int iStack_f94;
  int iStack_f90;
  int iStack_f8c;
  int local_f78;
  int iStack_f74;
  int iStack_f70;
  int iStack_f6c;
  int local_f58;
  int iStack_f54;
  int iStack_f50;
  int iStack_f4c;
  int local_f38;
  int iStack_f34;
  int iStack_f30;
  int iStack_f2c;
  int local_f18;
  int iStack_f14;
  int iStack_f10;
  int iStack_f0c;
  int local_ef8;
  int iStack_ef4;
  int iStack_ef0;
  int iStack_eec;
  int local_ed8;
  int iStack_ed4;
  int iStack_ed0;
  int iStack_ecc;
  int local_eb8;
  int iStack_eb4;
  int iStack_eb0;
  int iStack_eac;
  int local_e98;
  int iStack_e94;
  int iStack_e90;
  int iStack_e8c;
  int local_e78;
  int iStack_e74;
  int iStack_e70;
  int iStack_e6c;
  int local_e58;
  int iStack_e54;
  int iStack_e50;
  int iStack_e4c;
  int local_e38;
  int iStack_e34;
  int iStack_e30;
  int iStack_e2c;
  int local_e18;
  int iStack_e14;
  int iStack_e10;
  int iStack_e0c;
  int local_df8;
  int iStack_df4;
  int iStack_df0;
  int iStack_dec;
  int local_dd8;
  int iStack_dd4;
  int iStack_dd0;
  int iStack_dcc;
  int local_db8;
  int iStack_db4;
  int iStack_db0;
  int iStack_dac;
  int local_d98;
  int iStack_d94;
  int iStack_d90;
  int iStack_d8c;
  int local_d78;
  int iStack_d74;
  int iStack_d70;
  int iStack_d6c;
  int local_d58;
  int iStack_d54;
  int iStack_d50;
  int iStack_d4c;
  int local_d38;
  int iStack_d34;
  int iStack_d30;
  int iStack_d2c;
  int local_d18;
  int iStack_d14;
  int iStack_d10;
  int iStack_d0c;
  int local_cf8;
  int iStack_cf4;
  int iStack_cf0;
  int iStack_cec;
  int local_cd8;
  int iStack_cd4;
  int iStack_cd0;
  int iStack_ccc;
  int local_cb8;
  int iStack_cb4;
  int iStack_cb0;
  int iStack_cac;
  int local_c98;
  int iStack_c94;
  int iStack_c90;
  int iStack_c8c;
  int local_c78;
  int iStack_c74;
  int iStack_c70;
  int iStack_c6c;
  int local_c58;
  int iStack_c54;
  int iStack_c50;
  int iStack_c4c;
  int local_c38;
  int iStack_c34;
  int iStack_c30;
  int iStack_c2c;
  
  piVar161 = cospi_arr((int)in_DL);
  iVar145 = 1 << (in_DL - 1U & 0x1f);
  uVar146 = -piVar161[0x20] & 0xffffU | piVar161[0x20] << 0x10;
  uVar137 = CONCAT44(uVar146,uVar146);
  uVar138 = CONCAT44(uVar146,uVar146);
  uVar147 = CONCAT22((short)piVar161[0x20],(short)piVar161[0x20]);
  uVar139 = CONCAT44(uVar147,uVar147);
  uVar140 = CONCAT44(uVar147,uVar147);
  iVar148 = (piVar161[0x20] & 0xffffU) + piVar161[0x20] * -0x10000;
  uVar146 = (uint)*(ushort *)(piVar161 + 0x30) | piVar161[0x10] << 0x10;
  uVar141 = CONCAT44(uVar146,uVar146);
  uVar142 = CONCAT44(uVar146,uVar146);
  uVar146 = -piVar161[0x10] & 0xffffU | piVar161[0x30] << 0x10;
  uVar143 = CONCAT44(uVar146,uVar146);
  uVar144 = CONCAT44(uVar146,uVar146);
  iVar149 = (-piVar161[0x30] & 0xffffU) + piVar161[0x10] * -0x10000;
  uVar146 = (uint)*(ushort *)(piVar161 + 0x38) | piVar161[8] << 0x10;
  uVar150 = -piVar161[8] & 0xffffU | piVar161[0x38] << 0x10;
  uVar151 = (uint)*(ushort *)(piVar161 + 0x18) | piVar161[0x28] << 0x10;
  uVar152 = -piVar161[0x28] & 0xffffU | piVar161[0x18] << 0x10;
  uVar153 = (uint)*(ushort *)(piVar161 + 0x3c) | piVar161[4] << 0x10;
  uVar154 = -piVar161[4] & 0xffffU | piVar161[0x3c] << 0x10;
  uVar155 = (uint)*(ushort *)(piVar161 + 0x1c) | piVar161[0x24] << 0x10;
  uVar156 = -piVar161[0x24] & 0xffffU | piVar161[0x1c] << 0x10;
  uVar157 = (uint)*(ushort *)(piVar161 + 0x2c) | piVar161[0x14] << 0x10;
  uVar158 = -piVar161[0x14] & 0xffffU | piVar161[0x2c] << 0x10;
  uVar159 = (uint)*(ushort *)(piVar161 + 0xc) | piVar161[0x34] << 0x10;
  uVar160 = -piVar161[0x34] & 0xffffU | piVar161[0xc] << 0x10;
  auVar162 = paddsw(*in_RDI,in_RDI[0xf]);
  auVar163 = psubsw(*in_RDI,in_RDI[0xf]);
  auVar164 = paddsw(in_RDI[1],in_RDI[0xe]);
  auVar165 = psubsw(in_RDI[1],in_RDI[0xe]);
  auVar166 = paddsw(in_RDI[2],in_RDI[0xd]);
  auVar167 = psubsw(in_RDI[2],in_RDI[0xd]);
  auVar168 = paddsw(in_RDI[3],in_RDI[0xc]);
  auVar169 = psubsw(in_RDI[3],in_RDI[0xc]);
  auVar170 = paddsw(in_RDI[4],in_RDI[0xb]);
  auVar171 = psubsw(in_RDI[4],in_RDI[0xb]);
  auVar172 = paddsw(in_RDI[5],in_RDI[10]);
  auVar173 = psubsw(in_RDI[5],in_RDI[10]);
  auVar174 = paddsw(in_RDI[6],in_RDI[9]);
  auVar175 = psubsw(in_RDI[6],in_RDI[9]);
  auVar176 = paddsw(in_RDI[7],in_RDI[8]);
  auVar177 = psubsw(in_RDI[7],in_RDI[8]);
  auVar178 = paddsw(auVar162,auVar176);
  auVar162 = psubsw(auVar162,auVar176);
  auVar176 = paddsw(auVar164,auVar174);
  auVar164 = psubsw(auVar164,auVar174);
  auVar174 = paddsw(auVar166,auVar172);
  auVar166 = psubsw(auVar166,auVar172);
  auVar172 = paddsw(auVar168,auVar170);
  auVar168 = psubsw(auVar168,auVar170);
  local_1ad8 = auVar173._0_2_;
  uStack_1ad6 = auVar173._2_2_;
  uStack_1ad4 = auVar173._4_2_;
  uStack_1ad2 = auVar173._6_2_;
  local_1ae8 = auVar167._0_2_;
  uStack_1ae6 = auVar167._2_2_;
  uStack_1ae4 = auVar167._4_2_;
  uStack_1ae2 = auVar167._6_2_;
  uStack_1930 = auVar173._8_2_;
  uStack_192e = auVar173._10_2_;
  uStack_192c = auVar173._12_2_;
  uStack_192a = auVar173._14_2_;
  uStack_1940 = auVar167._8_2_;
  uStack_193e = auVar167._10_2_;
  uStack_193c = auVar167._12_2_;
  uStack_193a = auVar167._14_2_;
  auVar84._2_2_ = local_1ae8;
  auVar84._0_2_ = local_1ad8;
  auVar84._4_2_ = uStack_1ad6;
  auVar84._6_2_ = uStack_1ae6;
  auVar84._10_2_ = uStack_1ae4;
  auVar84._8_2_ = uStack_1ad4;
  auVar84._12_2_ = uStack_1ad2;
  auVar84._14_2_ = uStack_1ae2;
  auVar83._8_8_ = uVar138;
  auVar83._0_8_ = uVar137;
  auVar167 = pmaddwd(auVar84,auVar83);
  auVar82._2_2_ = uStack_1940;
  auVar82._0_2_ = uStack_1930;
  auVar82._4_2_ = uStack_192e;
  auVar82._6_2_ = uStack_193e;
  auVar82._10_2_ = uStack_193c;
  auVar82._8_2_ = uStack_192c;
  auVar82._12_2_ = uStack_192a;
  auVar82._14_2_ = uStack_193a;
  auVar81._8_8_ = uVar138;
  auVar81._0_8_ = uVar137;
  auVar170 = pmaddwd(auVar82,auVar81);
  auVar80._2_2_ = local_1ae8;
  auVar80._0_2_ = local_1ad8;
  auVar80._4_2_ = uStack_1ad6;
  auVar80._6_2_ = uStack_1ae6;
  auVar80._10_2_ = uStack_1ae4;
  auVar80._8_2_ = uStack_1ad4;
  auVar80._12_2_ = uStack_1ad2;
  auVar80._14_2_ = uStack_1ae2;
  auVar79._8_8_ = uVar140;
  auVar79._0_8_ = uVar139;
  auVar173 = pmaddwd(auVar80,auVar79);
  auVar78._2_2_ = uStack_1940;
  auVar78._0_2_ = uStack_1930;
  auVar78._4_2_ = uStack_192e;
  auVar78._6_2_ = uStack_193e;
  auVar78._10_2_ = uStack_193c;
  auVar78._8_2_ = uStack_192c;
  auVar78._12_2_ = uStack_192a;
  auVar78._14_2_ = uStack_193a;
  auVar77._8_8_ = uVar140;
  auVar77._0_8_ = uVar139;
  auVar179 = pmaddwd(auVar78,auVar77);
  local_c38 = auVar167._0_4_;
  iStack_c34 = auVar167._4_4_;
  iStack_c30 = auVar167._8_4_;
  iStack_c2c = auVar167._12_4_;
  local_c58 = auVar170._0_4_;
  iStack_c54 = auVar170._4_4_;
  iStack_c50 = auVar170._8_4_;
  iStack_c4c = auVar170._12_4_;
  local_c78 = auVar173._0_4_;
  iStack_c74 = auVar173._4_4_;
  iStack_c70 = auVar173._8_4_;
  iStack_c6c = auVar173._12_4_;
  local_c98 = auVar179._0_4_;
  iStack_c94 = auVar179._4_4_;
  iStack_c90 = auVar179._8_4_;
  iStack_c8c = auVar179._12_4_;
  auVar167 = ZEXT416((uint)(int)in_DL);
  auVar170 = ZEXT416((uint)(int)in_DL);
  auVar173 = ZEXT416((uint)(int)in_DL);
  auVar179 = ZEXT416((uint)(int)in_DL);
  auVar136._4_4_ = iStack_c34 + iVar145 >> auVar167;
  auVar136._0_4_ = local_c38 + iVar145 >> auVar167;
  auVar136._12_4_ = iStack_c2c + iVar145 >> auVar167;
  auVar136._8_4_ = iStack_c30 + iVar145 >> auVar167;
  auVar135._4_4_ = iStack_c54 + iVar145 >> auVar170;
  auVar135._0_4_ = local_c58 + iVar145 >> auVar170;
  auVar135._12_4_ = iStack_c4c + iVar145 >> auVar170;
  auVar135._8_4_ = iStack_c50 + iVar145 >> auVar170;
  auVar167 = packssdw(auVar136,auVar135);
  auVar134._4_4_ = iStack_c74 + iVar145 >> auVar173;
  auVar134._0_4_ = local_c78 + iVar145 >> auVar173;
  auVar134._12_4_ = iStack_c6c + iVar145 >> auVar173;
  auVar134._8_4_ = iStack_c70 + iVar145 >> auVar173;
  auVar133._4_4_ = iStack_c94 + iVar145 >> auVar179;
  auVar133._0_4_ = local_c98 + iVar145 >> auVar179;
  auVar133._12_4_ = iStack_c8c + iVar145 >> auVar179;
  auVar133._8_4_ = iStack_c90 + iVar145 >> auVar179;
  auVar170 = packssdw(auVar134,auVar133);
  local_1af8 = auVar171._0_2_;
  uStack_1af6 = auVar171._2_2_;
  uStack_1af4 = auVar171._4_2_;
  uStack_1af2 = auVar171._6_2_;
  local_1b08 = auVar169._0_2_;
  uStack_1b06 = auVar169._2_2_;
  uStack_1b04 = auVar169._4_2_;
  uStack_1b02 = auVar169._6_2_;
  uStack_1950 = auVar171._8_2_;
  uStack_194e = auVar171._10_2_;
  uStack_194c = auVar171._12_2_;
  uStack_194a = auVar171._14_2_;
  uStack_1960 = auVar169._8_2_;
  uStack_195e = auVar169._10_2_;
  uStack_195c = auVar169._12_2_;
  uStack_195a = auVar169._14_2_;
  auVar76._2_2_ = local_1b08;
  auVar76._0_2_ = local_1af8;
  auVar76._4_2_ = uStack_1af6;
  auVar76._6_2_ = uStack_1b06;
  auVar76._10_2_ = uStack_1b04;
  auVar76._8_2_ = uStack_1af4;
  auVar76._12_2_ = uStack_1af2;
  auVar76._14_2_ = uStack_1b02;
  auVar75._8_8_ = uVar138;
  auVar75._0_8_ = uVar137;
  auVar169 = pmaddwd(auVar76,auVar75);
  auVar74._2_2_ = uStack_1960;
  auVar74._0_2_ = uStack_1950;
  auVar74._4_2_ = uStack_194e;
  auVar74._6_2_ = uStack_195e;
  auVar74._10_2_ = uStack_195c;
  auVar74._8_2_ = uStack_194c;
  auVar74._12_2_ = uStack_194a;
  auVar74._14_2_ = uStack_195a;
  auVar73._8_8_ = uVar138;
  auVar73._0_8_ = uVar137;
  auVar171 = pmaddwd(auVar74,auVar73);
  auVar72._2_2_ = local_1b08;
  auVar72._0_2_ = local_1af8;
  auVar72._4_2_ = uStack_1af6;
  auVar72._6_2_ = uStack_1b06;
  auVar72._10_2_ = uStack_1b04;
  auVar72._8_2_ = uStack_1af4;
  auVar72._12_2_ = uStack_1af2;
  auVar72._14_2_ = uStack_1b02;
  auVar71._8_8_ = uVar140;
  auVar71._0_8_ = uVar139;
  auVar173 = pmaddwd(auVar72,auVar71);
  auVar70._2_2_ = uStack_1960;
  auVar70._0_2_ = uStack_1950;
  auVar70._4_2_ = uStack_194e;
  auVar70._6_2_ = uStack_195e;
  auVar70._10_2_ = uStack_195c;
  auVar70._8_2_ = uStack_194c;
  auVar70._12_2_ = uStack_194a;
  auVar70._14_2_ = uStack_195a;
  auVar69._8_8_ = uVar140;
  auVar69._0_8_ = uVar139;
  auVar179 = pmaddwd(auVar70,auVar69);
  local_cb8 = auVar169._0_4_;
  iStack_cb4 = auVar169._4_4_;
  iStack_cb0 = auVar169._8_4_;
  iStack_cac = auVar169._12_4_;
  local_cd8 = auVar171._0_4_;
  iStack_cd4 = auVar171._4_4_;
  iStack_cd0 = auVar171._8_4_;
  iStack_ccc = auVar171._12_4_;
  local_cf8 = auVar173._0_4_;
  iStack_cf4 = auVar173._4_4_;
  iStack_cf0 = auVar173._8_4_;
  iStack_cec = auVar173._12_4_;
  local_d18 = auVar179._0_4_;
  iStack_d14 = auVar179._4_4_;
  iStack_d10 = auVar179._8_4_;
  iStack_d0c = auVar179._12_4_;
  auVar169 = ZEXT416((uint)(int)in_DL);
  auVar171 = ZEXT416((uint)(int)in_DL);
  auVar173 = ZEXT416((uint)(int)in_DL);
  auVar179 = ZEXT416((uint)(int)in_DL);
  auVar132._4_4_ = iStack_cb4 + iVar145 >> auVar169;
  auVar132._0_4_ = local_cb8 + iVar145 >> auVar169;
  auVar132._12_4_ = iStack_cac + iVar145 >> auVar169;
  auVar132._8_4_ = iStack_cb0 + iVar145 >> auVar169;
  auVar131._4_4_ = iStack_cd4 + iVar145 >> auVar171;
  auVar131._0_4_ = local_cd8 + iVar145 >> auVar171;
  auVar131._12_4_ = iStack_ccc + iVar145 >> auVar171;
  auVar131._8_4_ = iStack_cd0 + iVar145 >> auVar171;
  auVar169 = packssdw(auVar132,auVar131);
  auVar130._4_4_ = iStack_cf4 + iVar145 >> auVar173;
  auVar130._0_4_ = local_cf8 + iVar145 >> auVar173;
  auVar130._12_4_ = iStack_cec + iVar145 >> auVar173;
  auVar130._8_4_ = iStack_cf0 + iVar145 >> auVar173;
  auVar129._4_4_ = iStack_d14 + iVar145 >> auVar179;
  auVar129._0_4_ = local_d18 + iVar145 >> auVar179;
  auVar129._12_4_ = iStack_d0c + iVar145 >> auVar179;
  auVar129._8_4_ = iStack_d10 + iVar145 >> auVar179;
  auVar171 = packssdw(auVar130,auVar129);
  auVar173 = paddsw(auVar178,auVar172);
  auVar172 = psubsw(auVar178,auVar172);
  auVar178 = paddsw(auVar176,auVar174);
  auVar174 = psubsw(auVar176,auVar174);
  local_1b18 = auVar166._0_2_;
  uStack_1b16 = auVar166._2_2_;
  uStack_1b14 = auVar166._4_2_;
  uStack_1b12 = auVar166._6_2_;
  local_1b28 = auVar164._0_2_;
  uStack_1b26 = auVar164._2_2_;
  uStack_1b24 = auVar164._4_2_;
  uStack_1b22 = auVar164._6_2_;
  uStack_1970 = auVar166._8_2_;
  uStack_196e = auVar166._10_2_;
  uStack_196c = auVar166._12_2_;
  uStack_196a = auVar166._14_2_;
  uStack_1980 = auVar164._8_2_;
  uStack_197e = auVar164._10_2_;
  uStack_197c = auVar164._12_2_;
  uStack_197a = auVar164._14_2_;
  auVar68._2_2_ = local_1b28;
  auVar68._0_2_ = local_1b18;
  auVar68._4_2_ = uStack_1b16;
  auVar68._6_2_ = uStack_1b26;
  auVar68._10_2_ = uStack_1b24;
  auVar68._8_2_ = uStack_1b14;
  auVar68._12_2_ = uStack_1b12;
  auVar68._14_2_ = uStack_1b22;
  auVar67._8_8_ = uVar138;
  auVar67._0_8_ = uVar137;
  auVar164 = pmaddwd(auVar68,auVar67);
  auVar66._2_2_ = uStack_1980;
  auVar66._0_2_ = uStack_1970;
  auVar66._4_2_ = uStack_196e;
  auVar66._6_2_ = uStack_197e;
  auVar66._10_2_ = uStack_197c;
  auVar66._8_2_ = uStack_196c;
  auVar66._12_2_ = uStack_196a;
  auVar66._14_2_ = uStack_197a;
  auVar65._8_8_ = uVar138;
  auVar65._0_8_ = uVar137;
  auVar166 = pmaddwd(auVar66,auVar65);
  auVar64._2_2_ = local_1b28;
  auVar64._0_2_ = local_1b18;
  auVar64._4_2_ = uStack_1b16;
  auVar64._6_2_ = uStack_1b26;
  auVar64._10_2_ = uStack_1b24;
  auVar64._8_2_ = uStack_1b14;
  auVar64._12_2_ = uStack_1b12;
  auVar64._14_2_ = uStack_1b22;
  auVar63._8_8_ = uVar140;
  auVar63._0_8_ = uVar139;
  auVar176 = pmaddwd(auVar64,auVar63);
  auVar62._2_2_ = uStack_1980;
  auVar62._0_2_ = uStack_1970;
  auVar62._4_2_ = uStack_196e;
  auVar62._6_2_ = uStack_197e;
  auVar62._10_2_ = uStack_197c;
  auVar62._8_2_ = uStack_196c;
  auVar62._12_2_ = uStack_196a;
  auVar62._14_2_ = uStack_197a;
  auVar61._8_8_ = uVar140;
  auVar61._0_8_ = uVar139;
  auVar179 = pmaddwd(auVar62,auVar61);
  local_d38 = auVar164._0_4_;
  iStack_d34 = auVar164._4_4_;
  iStack_d30 = auVar164._8_4_;
  iStack_d2c = auVar164._12_4_;
  local_d58 = auVar166._0_4_;
  iStack_d54 = auVar166._4_4_;
  iStack_d50 = auVar166._8_4_;
  iStack_d4c = auVar166._12_4_;
  local_d78 = auVar176._0_4_;
  iStack_d74 = auVar176._4_4_;
  iStack_d70 = auVar176._8_4_;
  iStack_d6c = auVar176._12_4_;
  local_d98 = auVar179._0_4_;
  iStack_d94 = auVar179._4_4_;
  iStack_d90 = auVar179._8_4_;
  iStack_d8c = auVar179._12_4_;
  auVar164 = ZEXT416((uint)(int)in_DL);
  auVar166 = ZEXT416((uint)(int)in_DL);
  auVar176 = ZEXT416((uint)(int)in_DL);
  auVar179 = ZEXT416((uint)(int)in_DL);
  auVar128._4_4_ = iStack_d34 + iVar145 >> auVar164;
  auVar128._0_4_ = local_d38 + iVar145 >> auVar164;
  auVar128._12_4_ = iStack_d2c + iVar145 >> auVar164;
  auVar128._8_4_ = iStack_d30 + iVar145 >> auVar164;
  auVar127._4_4_ = iStack_d54 + iVar145 >> auVar166;
  auVar127._0_4_ = local_d58 + iVar145 >> auVar166;
  auVar127._12_4_ = iStack_d4c + iVar145 >> auVar166;
  auVar127._8_4_ = iStack_d50 + iVar145 >> auVar166;
  auVar164 = packssdw(auVar128,auVar127);
  auVar126._4_4_ = iStack_d74 + iVar145 >> auVar176;
  auVar126._0_4_ = local_d78 + iVar145 >> auVar176;
  auVar126._12_4_ = iStack_d6c + iVar145 >> auVar176;
  auVar126._8_4_ = iStack_d70 + iVar145 >> auVar176;
  auVar125._4_4_ = iStack_d94 + iVar145 >> auVar179;
  auVar125._0_4_ = local_d98 + iVar145 >> auVar179;
  auVar125._12_4_ = iStack_d8c + iVar145 >> auVar179;
  auVar125._8_4_ = iStack_d90 + iVar145 >> auVar179;
  auVar166 = packssdw(auVar126,auVar125);
  auVar176 = paddsw(auVar177,auVar169);
  auVar169 = psubsw(auVar177,auVar169);
  auVar177 = paddsw(auVar175,auVar167);
  auVar167 = psubsw(auVar175,auVar167);
  auVar175 = psubsw(auVar163,auVar171);
  auVar163 = paddsw(auVar163,auVar171);
  auVar171 = psubsw(auVar165,auVar170);
  auVar165 = paddsw(auVar165,auVar170);
  local_1b38 = auVar173._0_2_;
  uStack_1b36 = auVar173._2_2_;
  uStack_1b34 = auVar173._4_2_;
  uStack_1b32 = auVar173._6_2_;
  local_1b48 = auVar178._0_2_;
  uStack_1b46 = auVar178._2_2_;
  uStack_1b44 = auVar178._4_2_;
  uStack_1b42 = auVar178._6_2_;
  uStack_1990 = auVar173._8_2_;
  uStack_198e = auVar173._10_2_;
  uStack_198c = auVar173._12_2_;
  uStack_198a = auVar173._14_2_;
  uStack_19a0 = auVar178._8_2_;
  uStack_199e = auVar178._10_2_;
  uStack_199c = auVar178._12_2_;
  uStack_199a = auVar178._14_2_;
  auVar60._2_2_ = local_1b48;
  auVar60._0_2_ = local_1b38;
  auVar60._4_2_ = uStack_1b36;
  auVar60._6_2_ = uStack_1b46;
  auVar60._10_2_ = uStack_1b44;
  auVar60._8_2_ = uStack_1b34;
  auVar60._12_2_ = uStack_1b32;
  auVar60._14_2_ = uStack_1b42;
  auVar59._8_8_ = uVar140;
  auVar59._0_8_ = uVar139;
  auVar170 = pmaddwd(auVar60,auVar59);
  auVar58._2_2_ = uStack_19a0;
  auVar58._0_2_ = uStack_1990;
  auVar58._4_2_ = uStack_198e;
  auVar58._6_2_ = uStack_199e;
  auVar58._10_2_ = uStack_199c;
  auVar58._8_2_ = uStack_198c;
  auVar58._12_2_ = uStack_198a;
  auVar58._14_2_ = uStack_199a;
  auVar57._8_8_ = uVar140;
  auVar57._0_8_ = uVar139;
  auVar173 = pmaddwd(auVar58,auVar57);
  auVar56._2_2_ = local_1b48;
  auVar56._0_2_ = local_1b38;
  auVar56._4_2_ = uStack_1b36;
  auVar56._6_2_ = uStack_1b46;
  auVar56._10_2_ = uStack_1b44;
  auVar56._8_2_ = uStack_1b34;
  auVar56._12_2_ = uStack_1b32;
  auVar56._14_2_ = uStack_1b42;
  auVar55._8_8_ = CONCAT44(iVar148,iVar148);
  auVar55._0_8_ = CONCAT44(iVar148,iVar148);
  auVar178 = pmaddwd(auVar56,auVar55);
  auVar54._2_2_ = uStack_19a0;
  auVar54._0_2_ = uStack_1990;
  auVar54._4_2_ = uStack_198e;
  auVar54._6_2_ = uStack_199e;
  auVar54._10_2_ = uStack_199c;
  auVar54._8_2_ = uStack_198c;
  auVar54._12_2_ = uStack_198a;
  auVar54._14_2_ = uStack_199a;
  auVar53._8_8_ = CONCAT44(iVar148,iVar148);
  auVar53._0_8_ = CONCAT44(iVar148,iVar148);
  auVar179 = pmaddwd(auVar54,auVar53);
  local_db8 = auVar170._0_4_;
  iStack_db4 = auVar170._4_4_;
  iStack_db0 = auVar170._8_4_;
  iStack_dac = auVar170._12_4_;
  local_dd8 = auVar173._0_4_;
  iStack_dd4 = auVar173._4_4_;
  iStack_dd0 = auVar173._8_4_;
  iStack_dcc = auVar173._12_4_;
  local_df8 = auVar178._0_4_;
  iStack_df4 = auVar178._4_4_;
  iStack_df0 = auVar178._8_4_;
  iStack_dec = auVar178._12_4_;
  local_e18 = auVar179._0_4_;
  iStack_e14 = auVar179._4_4_;
  iStack_e10 = auVar179._8_4_;
  iStack_e0c = auVar179._12_4_;
  auVar170 = ZEXT416((uint)(int)in_DL);
  auVar173 = ZEXT416((uint)(int)in_DL);
  auVar178 = ZEXT416((uint)(int)in_DL);
  auVar179 = ZEXT416((uint)(int)in_DL);
  auVar124._4_4_ = iStack_db4 + iVar145 >> auVar170;
  auVar124._0_4_ = local_db8 + iVar145 >> auVar170;
  auVar124._12_4_ = iStack_dac + iVar145 >> auVar170;
  auVar124._8_4_ = iStack_db0 + iVar145 >> auVar170;
  auVar123._4_4_ = iStack_dd4 + iVar145 >> auVar173;
  auVar123._0_4_ = local_dd8 + iVar145 >> auVar173;
  auVar123._12_4_ = iStack_dcc + iVar145 >> auVar173;
  auVar123._8_4_ = iStack_dd0 + iVar145 >> auVar173;
  auVar170 = packssdw(auVar124,auVar123);
  auVar122._4_4_ = iStack_df4 + iVar145 >> auVar178;
  auVar122._0_4_ = local_df8 + iVar145 >> auVar178;
  auVar122._12_4_ = iStack_dec + iVar145 >> auVar178;
  auVar122._8_4_ = iStack_df0 + iVar145 >> auVar178;
  auVar121._4_4_ = iStack_e14 + iVar145 >> auVar179;
  auVar121._0_4_ = local_e18 + iVar145 >> auVar179;
  auVar121._12_4_ = iStack_e0c + iVar145 >> auVar179;
  auVar121._8_4_ = iStack_e10 + iVar145 >> auVar179;
  auVar173 = packssdw(auVar122,auVar121);
  local_1b58 = auVar174._0_2_;
  uStack_1b56 = auVar174._2_2_;
  uStack_1b54 = auVar174._4_2_;
  uStack_1b52 = auVar174._6_2_;
  local_1b68 = auVar172._0_2_;
  uStack_1b66 = auVar172._2_2_;
  uStack_1b64 = auVar172._4_2_;
  uStack_1b62 = auVar172._6_2_;
  uStack_19b0 = auVar174._8_2_;
  uStack_19ae = auVar174._10_2_;
  uStack_19ac = auVar174._12_2_;
  uStack_19aa = auVar174._14_2_;
  uStack_19c0 = auVar172._8_2_;
  uStack_19be = auVar172._10_2_;
  uStack_19bc = auVar172._12_2_;
  uStack_19ba = auVar172._14_2_;
  auVar52._2_2_ = local_1b68;
  auVar52._0_2_ = local_1b58;
  auVar52._4_2_ = uStack_1b56;
  auVar52._6_2_ = uStack_1b66;
  auVar52._10_2_ = uStack_1b64;
  auVar52._8_2_ = uStack_1b54;
  auVar52._12_2_ = uStack_1b52;
  auVar52._14_2_ = uStack_1b62;
  auVar51._8_8_ = uVar142;
  auVar51._0_8_ = uVar141;
  auVar172 = pmaddwd(auVar52,auVar51);
  auVar50._2_2_ = uStack_19c0;
  auVar50._0_2_ = uStack_19b0;
  auVar50._4_2_ = uStack_19ae;
  auVar50._6_2_ = uStack_19be;
  auVar50._10_2_ = uStack_19bc;
  auVar50._8_2_ = uStack_19ac;
  auVar50._12_2_ = uStack_19aa;
  auVar50._14_2_ = uStack_19ba;
  auVar49._8_8_ = uVar142;
  auVar49._0_8_ = uVar141;
  auVar174 = pmaddwd(auVar50,auVar49);
  auVar48._2_2_ = local_1b68;
  auVar48._0_2_ = local_1b58;
  auVar48._4_2_ = uStack_1b56;
  auVar48._6_2_ = uStack_1b66;
  auVar48._10_2_ = uStack_1b64;
  auVar48._8_2_ = uStack_1b54;
  auVar48._12_2_ = uStack_1b52;
  auVar48._14_2_ = uStack_1b62;
  auVar47._8_8_ = uVar144;
  auVar47._0_8_ = uVar143;
  auVar178 = pmaddwd(auVar48,auVar47);
  auVar46._2_2_ = uStack_19c0;
  auVar46._0_2_ = uStack_19b0;
  auVar46._4_2_ = uStack_19ae;
  auVar46._6_2_ = uStack_19be;
  auVar46._10_2_ = uStack_19bc;
  auVar46._8_2_ = uStack_19ac;
  auVar46._12_2_ = uStack_19aa;
  auVar46._14_2_ = uStack_19ba;
  auVar45._8_8_ = uVar144;
  auVar45._0_8_ = uVar143;
  auVar179 = pmaddwd(auVar46,auVar45);
  local_e38 = auVar172._0_4_;
  iStack_e34 = auVar172._4_4_;
  iStack_e30 = auVar172._8_4_;
  iStack_e2c = auVar172._12_4_;
  local_e58 = auVar174._0_4_;
  iStack_e54 = auVar174._4_4_;
  iStack_e50 = auVar174._8_4_;
  iStack_e4c = auVar174._12_4_;
  local_e78 = auVar178._0_4_;
  iStack_e74 = auVar178._4_4_;
  iStack_e70 = auVar178._8_4_;
  iStack_e6c = auVar178._12_4_;
  local_e98 = auVar179._0_4_;
  iStack_e94 = auVar179._4_4_;
  iStack_e90 = auVar179._8_4_;
  iStack_e8c = auVar179._12_4_;
  auVar172 = ZEXT416((uint)(int)in_DL);
  auVar174 = ZEXT416((uint)(int)in_DL);
  auVar178 = ZEXT416((uint)(int)in_DL);
  auVar179 = ZEXT416((uint)(int)in_DL);
  auVar120._4_4_ = iStack_e34 + iVar145 >> auVar172;
  auVar120._0_4_ = local_e38 + iVar145 >> auVar172;
  auVar120._12_4_ = iStack_e2c + iVar145 >> auVar172;
  auVar120._8_4_ = iStack_e30 + iVar145 >> auVar172;
  auVar119._4_4_ = iStack_e54 + iVar145 >> auVar174;
  auVar119._0_4_ = local_e58 + iVar145 >> auVar174;
  auVar119._12_4_ = iStack_e4c + iVar145 >> auVar174;
  auVar119._8_4_ = iStack_e50 + iVar145 >> auVar174;
  auVar172 = packssdw(auVar120,auVar119);
  auVar118._4_4_ = iStack_e74 + iVar145 >> auVar178;
  auVar118._0_4_ = local_e78 + iVar145 >> auVar178;
  auVar118._12_4_ = iStack_e6c + iVar145 >> auVar178;
  auVar118._8_4_ = iStack_e70 + iVar145 >> auVar178;
  auVar117._4_4_ = iStack_e94 + iVar145 >> auVar179;
  auVar117._0_4_ = local_e98 + iVar145 >> auVar179;
  auVar117._12_4_ = iStack_e8c + iVar145 >> auVar179;
  auVar117._8_4_ = iStack_e90 + iVar145 >> auVar179;
  auVar174 = packssdw(auVar118,auVar117);
  auVar178 = paddsw(auVar168,auVar164);
  auVar164 = psubsw(auVar168,auVar164);
  auVar168 = psubsw(auVar162,auVar166);
  auVar162 = paddsw(auVar162,auVar166);
  local_1b78 = auVar177._0_2_;
  uStack_1b76 = auVar177._2_2_;
  uStack_1b74 = auVar177._4_2_;
  uStack_1b72 = auVar177._6_2_;
  local_1b88 = auVar165._0_2_;
  uStack_1b86 = auVar165._2_2_;
  uStack_1b84 = auVar165._4_2_;
  uStack_1b82 = auVar165._6_2_;
  uStack_19d0 = auVar177._8_2_;
  uStack_19ce = auVar177._10_2_;
  uStack_19cc = auVar177._12_2_;
  uStack_19ca = auVar177._14_2_;
  uStack_19e0 = auVar165._8_2_;
  uStack_19de = auVar165._10_2_;
  uStack_19dc = auVar165._12_2_;
  uStack_19da = auVar165._14_2_;
  auVar44._2_2_ = local_1b88;
  auVar44._0_2_ = local_1b78;
  auVar44._4_2_ = uStack_1b76;
  auVar44._6_2_ = uStack_1b86;
  auVar44._10_2_ = uStack_1b84;
  auVar44._8_2_ = uStack_1b74;
  auVar44._12_2_ = uStack_1b72;
  auVar44._14_2_ = uStack_1b82;
  auVar43._8_8_ = uVar144;
  auVar43._0_8_ = uVar143;
  auVar165 = pmaddwd(auVar44,auVar43);
  auVar42._2_2_ = uStack_19e0;
  auVar42._0_2_ = uStack_19d0;
  auVar42._4_2_ = uStack_19ce;
  auVar42._6_2_ = uStack_19de;
  auVar42._10_2_ = uStack_19dc;
  auVar42._8_2_ = uStack_19cc;
  auVar42._12_2_ = uStack_19ca;
  auVar42._14_2_ = uStack_19da;
  auVar41._8_8_ = uVar144;
  auVar41._0_8_ = uVar143;
  auVar166 = pmaddwd(auVar42,auVar41);
  auVar40._2_2_ = local_1b88;
  auVar40._0_2_ = local_1b78;
  auVar40._4_2_ = uStack_1b76;
  auVar40._6_2_ = uStack_1b86;
  auVar40._10_2_ = uStack_1b84;
  auVar40._8_2_ = uStack_1b74;
  auVar40._12_2_ = uStack_1b72;
  auVar40._14_2_ = uStack_1b82;
  auVar39._8_8_ = uVar142;
  auVar39._0_8_ = uVar141;
  auVar177 = pmaddwd(auVar40,auVar39);
  auVar38._2_2_ = uStack_19e0;
  auVar38._0_2_ = uStack_19d0;
  auVar38._4_2_ = uStack_19ce;
  auVar38._6_2_ = uStack_19de;
  auVar38._10_2_ = uStack_19dc;
  auVar38._8_2_ = uStack_19cc;
  auVar38._12_2_ = uStack_19ca;
  auVar38._14_2_ = uStack_19da;
  auVar37._8_8_ = uVar142;
  auVar37._0_8_ = uVar141;
  auVar179 = pmaddwd(auVar38,auVar37);
  local_eb8 = auVar165._0_4_;
  iStack_eb4 = auVar165._4_4_;
  iStack_eb0 = auVar165._8_4_;
  iStack_eac = auVar165._12_4_;
  local_ed8 = auVar166._0_4_;
  iStack_ed4 = auVar166._4_4_;
  iStack_ed0 = auVar166._8_4_;
  iStack_ecc = auVar166._12_4_;
  local_ef8 = auVar177._0_4_;
  iStack_ef4 = auVar177._4_4_;
  iStack_ef0 = auVar177._8_4_;
  iStack_eec = auVar177._12_4_;
  local_f18 = auVar179._0_4_;
  iStack_f14 = auVar179._4_4_;
  iStack_f10 = auVar179._8_4_;
  iStack_f0c = auVar179._12_4_;
  auVar165 = ZEXT416((uint)(int)in_DL);
  auVar166 = ZEXT416((uint)(int)in_DL);
  auVar177 = ZEXT416((uint)(int)in_DL);
  auVar179 = ZEXT416((uint)(int)in_DL);
  auVar116._4_4_ = iStack_eb4 + iVar145 >> auVar165;
  auVar116._0_4_ = local_eb8 + iVar145 >> auVar165;
  auVar116._12_4_ = iStack_eac + iVar145 >> auVar165;
  auVar116._8_4_ = iStack_eb0 + iVar145 >> auVar165;
  auVar115._4_4_ = iStack_ed4 + iVar145 >> auVar166;
  auVar115._0_4_ = local_ed8 + iVar145 >> auVar166;
  auVar115._12_4_ = iStack_ecc + iVar145 >> auVar166;
  auVar115._8_4_ = iStack_ed0 + iVar145 >> auVar166;
  auVar165 = packssdw(auVar116,auVar115);
  auVar114._4_4_ = iStack_ef4 + iVar145 >> auVar177;
  auVar114._0_4_ = local_ef8 + iVar145 >> auVar177;
  auVar114._12_4_ = iStack_eec + iVar145 >> auVar177;
  auVar114._8_4_ = iStack_ef0 + iVar145 >> auVar177;
  auVar113._4_4_ = iStack_f14 + iVar145 >> auVar179;
  auVar113._0_4_ = local_f18 + iVar145 >> auVar179;
  auVar113._12_4_ = iStack_f0c + iVar145 >> auVar179;
  auVar113._8_4_ = iStack_f10 + iVar145 >> auVar179;
  auVar166 = packssdw(auVar114,auVar113);
  local_1b98 = auVar167._0_2_;
  uStack_1b96 = auVar167._2_2_;
  uStack_1b94 = auVar167._4_2_;
  uStack_1b92 = auVar167._6_2_;
  local_1ba8 = auVar171._0_2_;
  uStack_1ba6 = auVar171._2_2_;
  uStack_1ba4 = auVar171._4_2_;
  uStack_1ba2 = auVar171._6_2_;
  uStack_19f0 = auVar167._8_2_;
  uStack_19ee = auVar167._10_2_;
  uStack_19ec = auVar167._12_2_;
  uStack_19ea = auVar167._14_2_;
  uStack_1a00 = auVar171._8_2_;
  uStack_19fe = auVar171._10_2_;
  uStack_19fc = auVar171._12_2_;
  uStack_19fa = auVar171._14_2_;
  auVar36._2_2_ = local_1ba8;
  auVar36._0_2_ = local_1b98;
  auVar36._4_2_ = uStack_1b96;
  auVar36._6_2_ = uStack_1ba6;
  auVar36._10_2_ = uStack_1ba4;
  auVar36._8_2_ = uStack_1b94;
  auVar36._12_2_ = uStack_1b92;
  auVar36._14_2_ = uStack_1ba2;
  auVar35._8_8_ = CONCAT44(iVar149,iVar149);
  auVar35._0_8_ = CONCAT44(iVar149,iVar149);
  auVar167 = pmaddwd(auVar36,auVar35);
  auVar34._2_2_ = uStack_1a00;
  auVar34._0_2_ = uStack_19f0;
  auVar34._4_2_ = uStack_19ee;
  auVar34._6_2_ = uStack_19fe;
  auVar34._10_2_ = uStack_19fc;
  auVar34._8_2_ = uStack_19ec;
  auVar34._12_2_ = uStack_19ea;
  auVar34._14_2_ = uStack_19fa;
  auVar33._8_8_ = CONCAT44(iVar149,iVar149);
  auVar33._0_8_ = CONCAT44(iVar149,iVar149);
  auVar171 = pmaddwd(auVar34,auVar33);
  auVar32._2_2_ = local_1ba8;
  auVar32._0_2_ = local_1b98;
  auVar32._4_2_ = uStack_1b96;
  auVar32._6_2_ = uStack_1ba6;
  auVar32._10_2_ = uStack_1ba4;
  auVar32._8_2_ = uStack_1b94;
  auVar32._12_2_ = uStack_1b92;
  auVar32._14_2_ = uStack_1ba2;
  auVar31._8_8_ = uVar144;
  auVar31._0_8_ = uVar143;
  auVar177 = pmaddwd(auVar32,auVar31);
  auVar30._2_2_ = uStack_1a00;
  auVar30._0_2_ = uStack_19f0;
  auVar30._4_2_ = uStack_19ee;
  auVar30._6_2_ = uStack_19fe;
  auVar30._10_2_ = uStack_19fc;
  auVar30._8_2_ = uStack_19ec;
  auVar30._12_2_ = uStack_19ea;
  auVar30._14_2_ = uStack_19fa;
  auVar29._8_8_ = uVar144;
  auVar29._0_8_ = uVar143;
  auVar179 = pmaddwd(auVar30,auVar29);
  local_f38 = auVar167._0_4_;
  iStack_f34 = auVar167._4_4_;
  iStack_f30 = auVar167._8_4_;
  iStack_f2c = auVar167._12_4_;
  local_f58 = auVar171._0_4_;
  iStack_f54 = auVar171._4_4_;
  iStack_f50 = auVar171._8_4_;
  iStack_f4c = auVar171._12_4_;
  local_f78 = auVar177._0_4_;
  iStack_f74 = auVar177._4_4_;
  iStack_f70 = auVar177._8_4_;
  iStack_f6c = auVar177._12_4_;
  local_f98 = auVar179._0_4_;
  iStack_f94 = auVar179._4_4_;
  iStack_f90 = auVar179._8_4_;
  iStack_f8c = auVar179._12_4_;
  auVar167 = ZEXT416((uint)(int)in_DL);
  auVar171 = ZEXT416((uint)(int)in_DL);
  auVar177 = ZEXT416((uint)(int)in_DL);
  auVar179 = ZEXT416((uint)(int)in_DL);
  auVar112._4_4_ = iStack_f34 + iVar145 >> auVar167;
  auVar112._0_4_ = local_f38 + iVar145 >> auVar167;
  auVar112._12_4_ = iStack_f2c + iVar145 >> auVar167;
  auVar112._8_4_ = iStack_f30 + iVar145 >> auVar167;
  auVar111._4_4_ = iStack_f54 + iVar145 >> auVar171;
  auVar111._0_4_ = local_f58 + iVar145 >> auVar171;
  auVar111._12_4_ = iStack_f4c + iVar145 >> auVar171;
  auVar111._8_4_ = iStack_f50 + iVar145 >> auVar171;
  auVar167 = packssdw(auVar112,auVar111);
  auVar110._4_4_ = iStack_f74 + iVar145 >> auVar177;
  auVar110._0_4_ = local_f78 + iVar145 >> auVar177;
  auVar110._12_4_ = iStack_f6c + iVar145 >> auVar177;
  auVar110._8_4_ = iStack_f70 + iVar145 >> auVar177;
  auVar109._4_4_ = iStack_f94 + iVar145 >> auVar179;
  auVar109._0_4_ = local_f98 + iVar145 >> auVar179;
  auVar109._12_4_ = iStack_f8c + iVar145 >> auVar179;
  auVar109._8_4_ = iStack_f90 + iVar145 >> auVar179;
  auVar171 = packssdw(auVar110,auVar109);
  local_2aa8 = auVar170._0_8_;
  uStack_2aa0 = auVar170._8_8_;
  local_2a98 = auVar173._0_8_;
  uStack_2a90 = auVar173._8_8_;
  local_2a88 = auVar172._0_8_;
  uStack_2a80 = auVar172._8_8_;
  local_2a78 = auVar174._0_8_;
  uStack_2a70 = auVar174._8_8_;
  local_1bb8 = auVar178._0_2_;
  uStack_1bb6 = auVar178._2_2_;
  uStack_1bb4 = auVar178._4_2_;
  uStack_1bb2 = auVar178._6_2_;
  local_1bc8 = auVar162._0_2_;
  uStack_1bc6 = auVar162._2_2_;
  uStack_1bc4 = auVar162._4_2_;
  uStack_1bc2 = auVar162._6_2_;
  uStack_1a10 = auVar178._8_2_;
  uStack_1a0e = auVar178._10_2_;
  uStack_1a0c = auVar178._12_2_;
  uStack_1a0a = auVar178._14_2_;
  uStack_1a20 = auVar162._8_2_;
  uStack_1a1e = auVar162._10_2_;
  uStack_1a1c = auVar162._12_2_;
  uStack_1a1a = auVar162._14_2_;
  auVar28._2_2_ = local_1bc8;
  auVar28._0_2_ = local_1bb8;
  auVar28._4_2_ = uStack_1bb6;
  auVar28._6_2_ = uStack_1bc6;
  auVar28._10_2_ = uStack_1bc4;
  auVar28._8_2_ = uStack_1bb4;
  auVar28._12_2_ = uStack_1bb2;
  auVar28._14_2_ = uStack_1bc2;
  auVar27._8_8_ = CONCAT44(uVar146,uVar146);
  auVar27._0_8_ = CONCAT44(uVar146,uVar146);
  auVar162 = pmaddwd(auVar28,auVar27);
  auVar26._2_2_ = uStack_1a20;
  auVar26._0_2_ = uStack_1a10;
  auVar26._4_2_ = uStack_1a0e;
  auVar26._6_2_ = uStack_1a1e;
  auVar26._10_2_ = uStack_1a1c;
  auVar26._8_2_ = uStack_1a0c;
  auVar26._12_2_ = uStack_1a0a;
  auVar26._14_2_ = uStack_1a1a;
  auVar25._8_8_ = CONCAT44(uVar146,uVar146);
  auVar25._0_8_ = CONCAT44(uVar146,uVar146);
  auVar170 = pmaddwd(auVar26,auVar25);
  auVar24._2_2_ = local_1bc8;
  auVar24._0_2_ = local_1bb8;
  auVar24._4_2_ = uStack_1bb6;
  auVar24._6_2_ = uStack_1bc6;
  auVar24._10_2_ = uStack_1bc4;
  auVar24._8_2_ = uStack_1bb4;
  auVar24._12_2_ = uStack_1bb2;
  auVar24._14_2_ = uStack_1bc2;
  auVar23._8_8_ = CONCAT44(uVar150,uVar150);
  auVar23._0_8_ = CONCAT44(uVar150,uVar150);
  auVar172 = pmaddwd(auVar24,auVar23);
  auVar22._2_2_ = uStack_1a20;
  auVar22._0_2_ = uStack_1a10;
  auVar22._4_2_ = uStack_1a0e;
  auVar22._6_2_ = uStack_1a1e;
  auVar22._10_2_ = uStack_1a1c;
  auVar22._8_2_ = uStack_1a0c;
  auVar22._12_2_ = uStack_1a0a;
  auVar22._14_2_ = uStack_1a1a;
  auVar21._8_8_ = CONCAT44(uVar150,uVar150);
  auVar21._0_8_ = CONCAT44(uVar150,uVar150);
  auVar173 = pmaddwd(auVar22,auVar21);
  local_fb8 = auVar162._0_4_;
  iStack_fb4 = auVar162._4_4_;
  iStack_fb0 = auVar162._8_4_;
  iStack_fac = auVar162._12_4_;
  local_fd8 = auVar170._0_4_;
  iStack_fd4 = auVar170._4_4_;
  iStack_fd0 = auVar170._8_4_;
  iStack_fcc = auVar170._12_4_;
  local_ff8 = auVar172._0_4_;
  iStack_ff4 = auVar172._4_4_;
  iStack_ff0 = auVar172._8_4_;
  iStack_fec = auVar172._12_4_;
  local_1018 = auVar173._0_4_;
  iStack_1014 = auVar173._4_4_;
  iStack_1010 = auVar173._8_4_;
  iStack_100c = auVar173._12_4_;
  auVar162 = ZEXT416((uint)(int)in_DL);
  auVar170 = ZEXT416((uint)(int)in_DL);
  auVar172 = ZEXT416((uint)(int)in_DL);
  auVar173 = ZEXT416((uint)(int)in_DL);
  auVar108._4_4_ = iStack_fb4 + iVar145 >> auVar162;
  auVar108._0_4_ = local_fb8 + iVar145 >> auVar162;
  auVar108._12_4_ = iStack_fac + iVar145 >> auVar162;
  auVar108._8_4_ = iStack_fb0 + iVar145 >> auVar162;
  auVar107._4_4_ = iStack_fd4 + iVar145 >> auVar170;
  auVar107._0_4_ = local_fd8 + iVar145 >> auVar170;
  auVar107._12_4_ = iStack_fcc + iVar145 >> auVar170;
  auVar107._8_4_ = iStack_fd0 + iVar145 >> auVar170;
  auVar162 = packssdw(auVar108,auVar107);
  auVar106._4_4_ = iStack_ff4 + iVar145 >> auVar172;
  auVar106._0_4_ = local_ff8 + iVar145 >> auVar172;
  auVar106._12_4_ = iStack_fec + iVar145 >> auVar172;
  auVar106._8_4_ = iStack_ff0 + iVar145 >> auVar172;
  auVar105._4_4_ = iStack_1014 + iVar145 >> auVar173;
  auVar105._0_4_ = local_1018 + iVar145 >> auVar173;
  auVar105._12_4_ = iStack_100c + iVar145 >> auVar173;
  auVar105._8_4_ = iStack_1010 + iVar145 >> auVar173;
  auVar170 = packssdw(auVar106,auVar105);
  local_1bd8 = auVar164._0_2_;
  uStack_1bd6 = auVar164._2_2_;
  uStack_1bd4 = auVar164._4_2_;
  uStack_1bd2 = auVar164._6_2_;
  local_1be8 = auVar168._0_2_;
  uStack_1be6 = auVar168._2_2_;
  uStack_1be4 = auVar168._4_2_;
  uStack_1be2 = auVar168._6_2_;
  uStack_1a30 = auVar164._8_2_;
  uStack_1a2e = auVar164._10_2_;
  uStack_1a2c = auVar164._12_2_;
  uStack_1a2a = auVar164._14_2_;
  uStack_1a40 = auVar168._8_2_;
  uStack_1a3e = auVar168._10_2_;
  uStack_1a3c = auVar168._12_2_;
  uStack_1a3a = auVar168._14_2_;
  auVar20._2_2_ = local_1be8;
  auVar20._0_2_ = local_1bd8;
  auVar20._4_2_ = uStack_1bd6;
  auVar20._6_2_ = uStack_1be6;
  auVar20._10_2_ = uStack_1be4;
  auVar20._8_2_ = uStack_1bd4;
  auVar20._12_2_ = uStack_1bd2;
  auVar20._14_2_ = uStack_1be2;
  auVar19._8_8_ = CONCAT44(uVar151,uVar151);
  auVar19._0_8_ = CONCAT44(uVar151,uVar151);
  auVar164 = pmaddwd(auVar20,auVar19);
  auVar18._2_2_ = uStack_1a40;
  auVar18._0_2_ = uStack_1a30;
  auVar18._4_2_ = uStack_1a2e;
  auVar18._6_2_ = uStack_1a3e;
  auVar18._10_2_ = uStack_1a3c;
  auVar18._8_2_ = uStack_1a2c;
  auVar18._12_2_ = uStack_1a2a;
  auVar18._14_2_ = uStack_1a3a;
  auVar17._8_8_ = CONCAT44(uVar151,uVar151);
  auVar17._0_8_ = CONCAT44(uVar151,uVar151);
  auVar168 = pmaddwd(auVar18,auVar17);
  auVar16._2_2_ = local_1be8;
  auVar16._0_2_ = local_1bd8;
  auVar16._4_2_ = uStack_1bd6;
  auVar16._6_2_ = uStack_1be6;
  auVar16._10_2_ = uStack_1be4;
  auVar16._8_2_ = uStack_1bd4;
  auVar16._12_2_ = uStack_1bd2;
  auVar16._14_2_ = uStack_1be2;
  auVar15._8_8_ = CONCAT44(uVar152,uVar152);
  auVar15._0_8_ = CONCAT44(uVar152,uVar152);
  auVar172 = pmaddwd(auVar16,auVar15);
  auVar14._2_2_ = uStack_1a40;
  auVar14._0_2_ = uStack_1a30;
  auVar14._4_2_ = uStack_1a2e;
  auVar14._6_2_ = uStack_1a3e;
  auVar14._10_2_ = uStack_1a3c;
  auVar14._8_2_ = uStack_1a2c;
  auVar14._12_2_ = uStack_1a2a;
  auVar14._14_2_ = uStack_1a3a;
  auVar13._8_8_ = CONCAT44(uVar152,uVar152);
  auVar13._0_8_ = CONCAT44(uVar152,uVar152);
  auVar173 = pmaddwd(auVar14,auVar13);
  local_1038 = auVar164._0_4_;
  iStack_1034 = auVar164._4_4_;
  iStack_1030 = auVar164._8_4_;
  iStack_102c = auVar164._12_4_;
  local_1058 = auVar168._0_4_;
  iStack_1054 = auVar168._4_4_;
  iStack_1050 = auVar168._8_4_;
  iStack_104c = auVar168._12_4_;
  local_1078 = auVar172._0_4_;
  iStack_1074 = auVar172._4_4_;
  iStack_1070 = auVar172._8_4_;
  iStack_106c = auVar172._12_4_;
  local_1098 = auVar173._0_4_;
  iStack_1094 = auVar173._4_4_;
  iStack_1090 = auVar173._8_4_;
  iStack_108c = auVar173._12_4_;
  auVar164 = ZEXT416((uint)(int)in_DL);
  auVar168 = ZEXT416((uint)(int)in_DL);
  auVar172 = ZEXT416((uint)(int)in_DL);
  auVar173 = ZEXT416((uint)(int)in_DL);
  auVar104._4_4_ = iStack_1034 + iVar145 >> auVar164;
  auVar104._0_4_ = local_1038 + iVar145 >> auVar164;
  auVar104._12_4_ = iStack_102c + iVar145 >> auVar164;
  auVar104._8_4_ = iStack_1030 + iVar145 >> auVar164;
  auVar103._4_4_ = iStack_1054 + iVar145 >> auVar168;
  auVar103._0_4_ = local_1058 + iVar145 >> auVar168;
  auVar103._12_4_ = iStack_104c + iVar145 >> auVar168;
  auVar103._8_4_ = iStack_1050 + iVar145 >> auVar168;
  auVar164 = packssdw(auVar104,auVar103);
  auVar102._4_4_ = iStack_1074 + iVar145 >> auVar172;
  auVar102._0_4_ = local_1078 + iVar145 >> auVar172;
  auVar102._12_4_ = iStack_106c + iVar145 >> auVar172;
  auVar102._8_4_ = iStack_1070 + iVar145 >> auVar172;
  auVar101._4_4_ = iStack_1094 + iVar145 >> auVar173;
  auVar101._0_4_ = local_1098 + iVar145 >> auVar173;
  auVar101._12_4_ = iStack_108c + iVar145 >> auVar173;
  auVar101._8_4_ = iStack_1090 + iVar145 >> auVar173;
  auVar168 = packssdw(auVar102,auVar101);
  auVar172 = paddsw(auVar176,auVar165);
  auVar165 = psubsw(auVar176,auVar165);
  auVar173 = psubsw(auVar169,auVar167);
  auVar167 = paddsw(auVar169,auVar167);
  auVar169 = paddsw(auVar175,auVar171);
  auVar171 = psubsw(auVar175,auVar171);
  auVar174 = psubsw(auVar163,auVar166);
  auVar163 = paddsw(auVar163,auVar166);
  local_2ee8 = auVar162._0_8_;
  uStack_2ee0 = auVar162._8_8_;
  local_2ed8 = auVar164._0_8_;
  uStack_2ed0 = auVar164._8_8_;
  local_2ec8 = auVar168._0_8_;
  uStack_2ec0 = auVar168._8_8_;
  local_2eb8 = auVar170._0_8_;
  uStack_2eb0 = auVar170._8_8_;
  local_1bf8 = auVar172._0_2_;
  uStack_1bf6 = auVar172._2_2_;
  uStack_1bf4 = auVar172._4_2_;
  uStack_1bf2 = auVar172._6_2_;
  local_1c08 = auVar163._0_2_;
  uStack_1c06 = auVar163._2_2_;
  uStack_1c04 = auVar163._4_2_;
  uStack_1c02 = auVar163._6_2_;
  uStack_1a50 = auVar172._8_2_;
  uStack_1a4e = auVar172._10_2_;
  uStack_1a4c = auVar172._12_2_;
  uStack_1a4a = auVar172._14_2_;
  uStack_1a60 = auVar163._8_2_;
  uStack_1a5e = auVar163._10_2_;
  uStack_1a5c = auVar163._12_2_;
  uStack_1a5a = auVar163._14_2_;
  auVar12._2_2_ = local_1c08;
  auVar12._0_2_ = local_1bf8;
  auVar12._4_2_ = uStack_1bf6;
  auVar12._6_2_ = uStack_1c06;
  auVar12._10_2_ = uStack_1c04;
  auVar12._8_2_ = uStack_1bf4;
  auVar12._12_2_ = uStack_1bf2;
  auVar12._14_2_ = uStack_1c02;
  auVar11._8_8_ = CONCAT44(uVar153,uVar153);
  auVar11._0_8_ = CONCAT44(uVar153,uVar153);
  auVar162 = pmaddwd(auVar12,auVar11);
  auVar10._2_2_ = uStack_1a60;
  auVar10._0_2_ = uStack_1a50;
  auVar10._4_2_ = uStack_1a4e;
  auVar10._6_2_ = uStack_1a5e;
  auVar10._10_2_ = uStack_1a5c;
  auVar10._8_2_ = uStack_1a4c;
  auVar10._12_2_ = uStack_1a4a;
  auVar10._14_2_ = uStack_1a5a;
  auVar9._8_8_ = CONCAT44(uVar153,uVar153);
  auVar9._0_8_ = CONCAT44(uVar153,uVar153);
  auVar163 = pmaddwd(auVar10,auVar9);
  auVar8._2_2_ = local_1c08;
  auVar8._0_2_ = local_1bf8;
  auVar8._4_2_ = uStack_1bf6;
  auVar8._6_2_ = uStack_1c06;
  auVar8._10_2_ = uStack_1c04;
  auVar8._8_2_ = uStack_1bf4;
  auVar8._12_2_ = uStack_1bf2;
  auVar8._14_2_ = uStack_1c02;
  auVar7._8_8_ = CONCAT44(uVar154,uVar154);
  auVar7._0_8_ = CONCAT44(uVar154,uVar154);
  auVar164 = pmaddwd(auVar8,auVar7);
  auVar181._2_2_ = uStack_1a60;
  auVar181._0_2_ = uStack_1a50;
  auVar181._4_2_ = uStack_1a4e;
  auVar181._6_2_ = uStack_1a5e;
  auVar181._10_2_ = uStack_1a5c;
  auVar181._8_2_ = uStack_1a4c;
  auVar181._12_2_ = uStack_1a4a;
  auVar181._14_2_ = uStack_1a5a;
  auVar180._8_8_ = CONCAT44(uVar154,uVar154);
  auVar180._0_8_ = CONCAT44(uVar154,uVar154);
  auVar166 = pmaddwd(auVar181,auVar180);
  local_10b8 = auVar162._0_4_;
  iStack_10b4 = auVar162._4_4_;
  iStack_10b0 = auVar162._8_4_;
  iStack_10ac = auVar162._12_4_;
  local_10d8 = auVar163._0_4_;
  iStack_10d4 = auVar163._4_4_;
  iStack_10d0 = auVar163._8_4_;
  iStack_10cc = auVar163._12_4_;
  local_10f8 = auVar164._0_4_;
  iStack_10f4 = auVar164._4_4_;
  iStack_10f0 = auVar164._8_4_;
  iStack_10ec = auVar164._12_4_;
  local_1118 = auVar166._0_4_;
  iStack_1114 = auVar166._4_4_;
  iStack_1110 = auVar166._8_4_;
  iStack_110c = auVar166._12_4_;
  auVar162 = ZEXT416((uint)(int)in_DL);
  auVar163 = ZEXT416((uint)(int)in_DL);
  auVar164 = ZEXT416((uint)(int)in_DL);
  auVar166 = ZEXT416((uint)(int)in_DL);
  auVar100._4_4_ = iStack_10b4 + iVar145 >> auVar162;
  auVar100._0_4_ = local_10b8 + iVar145 >> auVar162;
  auVar100._12_4_ = iStack_10ac + iVar145 >> auVar162;
  auVar100._8_4_ = iStack_10b0 + iVar145 >> auVar162;
  auVar99._4_4_ = iStack_10d4 + iVar145 >> auVar163;
  auVar99._0_4_ = local_10d8 + iVar145 >> auVar163;
  auVar99._12_4_ = iStack_10cc + iVar145 >> auVar163;
  auVar99._8_4_ = iStack_10d0 + iVar145 >> auVar163;
  auVar180 = packssdw(auVar100,auVar99);
  auVar98._4_4_ = iStack_10f4 + iVar145 >> auVar164;
  auVar98._0_4_ = local_10f8 + iVar145 >> auVar164;
  auVar98._12_4_ = iStack_10ec + iVar145 >> auVar164;
  auVar98._8_4_ = iStack_10f0 + iVar145 >> auVar164;
  auVar97._4_4_ = iStack_1114 + iVar145 >> auVar166;
  auVar97._0_4_ = local_1118 + iVar145 >> auVar166;
  auVar97._12_4_ = iStack_110c + iVar145 >> auVar166;
  auVar97._8_4_ = iStack_1110 + iVar145 >> auVar166;
  auVar181 = packssdw(auVar98,auVar97);
  local_1c18 = auVar165._0_2_;
  uStack_1c16 = auVar165._2_2_;
  uStack_1c14 = auVar165._4_2_;
  uStack_1c12 = auVar165._6_2_;
  local_1c28 = auVar174._0_2_;
  uStack_1c26 = auVar174._2_2_;
  uStack_1c24 = auVar174._4_2_;
  uStack_1c22 = auVar174._6_2_;
  uStack_1a70 = auVar165._8_2_;
  uStack_1a6e = auVar165._10_2_;
  uStack_1a6c = auVar165._12_2_;
  uStack_1a6a = auVar165._14_2_;
  uStack_1a80 = auVar174._8_2_;
  uStack_1a7e = auVar174._10_2_;
  uStack_1a7c = auVar174._12_2_;
  uStack_1a7a = auVar174._14_2_;
  auVar6._2_2_ = local_1c28;
  auVar6._0_2_ = local_1c18;
  auVar6._4_2_ = uStack_1c16;
  auVar6._6_2_ = uStack_1c26;
  auVar6._10_2_ = uStack_1c24;
  auVar6._8_2_ = uStack_1c14;
  auVar6._12_2_ = uStack_1c12;
  auVar6._14_2_ = uStack_1c22;
  auVar5._8_8_ = CONCAT44(uVar155,uVar155);
  auVar5._0_8_ = CONCAT44(uVar155,uVar155);
  auVar162 = pmaddwd(auVar6,auVar5);
  auVar4._2_2_ = uStack_1a80;
  auVar4._0_2_ = uStack_1a70;
  auVar4._4_2_ = uStack_1a6e;
  auVar4._6_2_ = uStack_1a7e;
  auVar4._10_2_ = uStack_1a7c;
  auVar4._8_2_ = uStack_1a6c;
  auVar4._12_2_ = uStack_1a6a;
  auVar4._14_2_ = uStack_1a7a;
  auVar3._8_8_ = CONCAT44(uVar155,uVar155);
  auVar3._0_8_ = CONCAT44(uVar155,uVar155);
  auVar163 = pmaddwd(auVar4,auVar3);
  auVar2._2_2_ = local_1c28;
  auVar2._0_2_ = local_1c18;
  auVar2._4_2_ = uStack_1c16;
  auVar2._6_2_ = uStack_1c26;
  auVar2._10_2_ = uStack_1c24;
  auVar2._8_2_ = uStack_1c14;
  auVar2._12_2_ = uStack_1c12;
  auVar2._14_2_ = uStack_1c22;
  auVar1._8_8_ = CONCAT44(uVar156,uVar156);
  auVar1._0_8_ = CONCAT44(uVar156,uVar156);
  auVar164 = pmaddwd(auVar2,auVar1);
  auVar179._2_2_ = uStack_1a80;
  auVar179._0_2_ = uStack_1a70;
  auVar179._4_2_ = uStack_1a6e;
  auVar179._6_2_ = uStack_1a7e;
  auVar179._10_2_ = uStack_1a7c;
  auVar179._8_2_ = uStack_1a6c;
  auVar179._12_2_ = uStack_1a6a;
  auVar179._14_2_ = uStack_1a7a;
  auVar178._8_8_ = CONCAT44(uVar156,uVar156);
  auVar178._0_8_ = CONCAT44(uVar156,uVar156);
  auVar165 = pmaddwd(auVar179,auVar178);
  local_1138 = auVar162._0_4_;
  iStack_1134 = auVar162._4_4_;
  iStack_1130 = auVar162._8_4_;
  iStack_112c = auVar162._12_4_;
  local_1158 = auVar163._0_4_;
  iStack_1154 = auVar163._4_4_;
  iStack_1150 = auVar163._8_4_;
  iStack_114c = auVar163._12_4_;
  local_1178 = auVar164._0_4_;
  iStack_1174 = auVar164._4_4_;
  iStack_1170 = auVar164._8_4_;
  iStack_116c = auVar164._12_4_;
  local_1198 = auVar165._0_4_;
  iStack_1194 = auVar165._4_4_;
  iStack_1190 = auVar165._8_4_;
  iStack_118c = auVar165._12_4_;
  auVar162 = ZEXT416((uint)(int)in_DL);
  auVar163 = ZEXT416((uint)(int)in_DL);
  auVar164 = ZEXT416((uint)(int)in_DL);
  auVar165 = ZEXT416((uint)(int)in_DL);
  auVar96._4_4_ = iStack_1134 + iVar145 >> auVar162;
  auVar96._0_4_ = local_1138 + iVar145 >> auVar162;
  auVar96._12_4_ = iStack_112c + iVar145 >> auVar162;
  auVar96._8_4_ = iStack_1130 + iVar145 >> auVar162;
  auVar95._4_4_ = iStack_1154 + iVar145 >> auVar163;
  auVar95._0_4_ = local_1158 + iVar145 >> auVar163;
  auVar95._12_4_ = iStack_114c + iVar145 >> auVar163;
  auVar95._8_4_ = iStack_1150 + iVar145 >> auVar163;
  auVar178 = packssdw(auVar96,auVar95);
  auVar94._4_4_ = iStack_1174 + iVar145 >> auVar164;
  auVar94._0_4_ = local_1178 + iVar145 >> auVar164;
  auVar94._12_4_ = iStack_116c + iVar145 >> auVar164;
  auVar94._8_4_ = iStack_1170 + iVar145 >> auVar164;
  auVar93._4_4_ = iStack_1194 + iVar145 >> auVar165;
  auVar93._0_4_ = local_1198 + iVar145 >> auVar165;
  auVar93._12_4_ = iStack_118c + iVar145 >> auVar165;
  auVar93._8_4_ = iStack_1190 + iVar145 >> auVar165;
  auVar179 = packssdw(auVar94,auVar93);
  local_1c38 = auVar173._0_2_;
  uStack_1c36 = auVar173._2_2_;
  uStack_1c34 = auVar173._4_2_;
  uStack_1c32 = auVar173._6_2_;
  local_1c48 = auVar171._0_2_;
  uStack_1c46 = auVar171._2_2_;
  uStack_1c44 = auVar171._4_2_;
  uStack_1c42 = auVar171._6_2_;
  uStack_1a90 = auVar173._8_2_;
  uStack_1a8e = auVar173._10_2_;
  uStack_1a8c = auVar173._12_2_;
  uStack_1a8a = auVar173._14_2_;
  uStack_1aa0 = auVar171._8_2_;
  uStack_1a9e = auVar171._10_2_;
  uStack_1a9c = auVar171._12_2_;
  uStack_1a9a = auVar171._14_2_;
  auVar177._2_2_ = local_1c48;
  auVar177._0_2_ = local_1c38;
  auVar177._4_2_ = uStack_1c36;
  auVar177._6_2_ = uStack_1c46;
  auVar177._10_2_ = uStack_1c44;
  auVar177._8_2_ = uStack_1c34;
  auVar177._12_2_ = uStack_1c32;
  auVar177._14_2_ = uStack_1c42;
  auVar176._8_8_ = CONCAT44(uVar157,uVar157);
  auVar176._0_8_ = CONCAT44(uVar157,uVar157);
  auVar162 = pmaddwd(auVar177,auVar176);
  auVar175._2_2_ = uStack_1aa0;
  auVar175._0_2_ = uStack_1a90;
  auVar175._4_2_ = uStack_1a8e;
  auVar175._6_2_ = uStack_1a9e;
  auVar175._10_2_ = uStack_1a9c;
  auVar175._8_2_ = uStack_1a8c;
  auVar175._12_2_ = uStack_1a8a;
  auVar175._14_2_ = uStack_1a9a;
  auVar174._8_8_ = CONCAT44(uVar157,uVar157);
  auVar174._0_8_ = CONCAT44(uVar157,uVar157);
  auVar163 = pmaddwd(auVar175,auVar174);
  auVar173._2_2_ = local_1c48;
  auVar173._0_2_ = local_1c38;
  auVar173._4_2_ = uStack_1c36;
  auVar173._6_2_ = uStack_1c46;
  auVar173._10_2_ = uStack_1c44;
  auVar173._8_2_ = uStack_1c34;
  auVar173._12_2_ = uStack_1c32;
  auVar173._14_2_ = uStack_1c42;
  auVar172._8_8_ = CONCAT44(uVar158,uVar158);
  auVar172._0_8_ = CONCAT44(uVar158,uVar158);
  auVar164 = pmaddwd(auVar173,auVar172);
  auVar171._2_2_ = uStack_1aa0;
  auVar171._0_2_ = uStack_1a90;
  auVar171._4_2_ = uStack_1a8e;
  auVar171._6_2_ = uStack_1a9e;
  auVar171._10_2_ = uStack_1a9c;
  auVar171._8_2_ = uStack_1a8c;
  auVar171._12_2_ = uStack_1a8a;
  auVar171._14_2_ = uStack_1a9a;
  auVar170._8_8_ = CONCAT44(uVar158,uVar158);
  auVar170._0_8_ = CONCAT44(uVar158,uVar158);
  auVar165 = pmaddwd(auVar171,auVar170);
  local_11b8 = auVar162._0_4_;
  iStack_11b4 = auVar162._4_4_;
  iStack_11b0 = auVar162._8_4_;
  iStack_11ac = auVar162._12_4_;
  local_11d8 = auVar163._0_4_;
  iStack_11d4 = auVar163._4_4_;
  iStack_11d0 = auVar163._8_4_;
  iStack_11cc = auVar163._12_4_;
  local_11f8 = auVar164._0_4_;
  iStack_11f4 = auVar164._4_4_;
  iStack_11f0 = auVar164._8_4_;
  iStack_11ec = auVar164._12_4_;
  local_1218 = auVar165._0_4_;
  iStack_1214 = auVar165._4_4_;
  iStack_1210 = auVar165._8_4_;
  iStack_120c = auVar165._12_4_;
  auVar162 = ZEXT416((uint)(int)in_DL);
  auVar163 = ZEXT416((uint)(int)in_DL);
  auVar164 = ZEXT416((uint)(int)in_DL);
  auVar165 = ZEXT416((uint)(int)in_DL);
  auVar92._4_4_ = iStack_11b4 + iVar145 >> auVar162;
  auVar92._0_4_ = local_11b8 + iVar145 >> auVar162;
  auVar92._12_4_ = iStack_11ac + iVar145 >> auVar162;
  auVar92._8_4_ = iStack_11b0 + iVar145 >> auVar162;
  auVar91._4_4_ = iStack_11d4 + iVar145 >> auVar163;
  auVar91._0_4_ = local_11d8 + iVar145 >> auVar163;
  auVar91._12_4_ = iStack_11cc + iVar145 >> auVar163;
  auVar91._8_4_ = iStack_11d0 + iVar145 >> auVar163;
  auVar170 = packssdw(auVar92,auVar91);
  auVar90._4_4_ = iStack_11f4 + iVar145 >> auVar164;
  auVar90._0_4_ = local_11f8 + iVar145 >> auVar164;
  auVar90._12_4_ = iStack_11ec + iVar145 >> auVar164;
  auVar90._8_4_ = iStack_11f0 + iVar145 >> auVar164;
  auVar89._4_4_ = iStack_1214 + iVar145 >> auVar165;
  auVar89._0_4_ = local_1218 + iVar145 >> auVar165;
  auVar89._12_4_ = iStack_120c + iVar145 >> auVar165;
  auVar89._8_4_ = iStack_1210 + iVar145 >> auVar165;
  auVar171 = packssdw(auVar90,auVar89);
  local_1c58 = auVar167._0_2_;
  uStack_1c56 = auVar167._2_2_;
  uStack_1c54 = auVar167._4_2_;
  uStack_1c52 = auVar167._6_2_;
  local_1c68 = auVar169._0_2_;
  uStack_1c66 = auVar169._2_2_;
  uStack_1c64 = auVar169._4_2_;
  uStack_1c62 = auVar169._6_2_;
  uStack_1ab0 = auVar167._8_2_;
  uStack_1aae = auVar167._10_2_;
  uStack_1aac = auVar167._12_2_;
  uStack_1aaa = auVar167._14_2_;
  uStack_1ac0 = auVar169._8_2_;
  uStack_1abe = auVar169._10_2_;
  uStack_1abc = auVar169._12_2_;
  uStack_1aba = auVar169._14_2_;
  auVar169._2_2_ = local_1c68;
  auVar169._0_2_ = local_1c58;
  auVar169._4_2_ = uStack_1c56;
  auVar169._6_2_ = uStack_1c66;
  auVar169._10_2_ = uStack_1c64;
  auVar169._8_2_ = uStack_1c54;
  auVar169._12_2_ = uStack_1c52;
  auVar169._14_2_ = uStack_1c62;
  auVar168._8_8_ = CONCAT44(uVar159,uVar159);
  auVar168._0_8_ = CONCAT44(uVar159,uVar159);
  auVar168 = pmaddwd(auVar169,auVar168);
  auVar167._2_2_ = uStack_1ac0;
  auVar167._0_2_ = uStack_1ab0;
  auVar167._4_2_ = uStack_1aae;
  auVar167._6_2_ = uStack_1abe;
  auVar167._10_2_ = uStack_1abc;
  auVar167._8_2_ = uStack_1aac;
  auVar167._12_2_ = uStack_1aaa;
  auVar167._14_2_ = uStack_1aba;
  auVar166._8_8_ = CONCAT44(uVar159,uVar159);
  auVar166._0_8_ = CONCAT44(uVar159,uVar159);
  auVar166 = pmaddwd(auVar167,auVar166);
  auVar165._2_2_ = local_1c68;
  auVar165._0_2_ = local_1c58;
  auVar165._4_2_ = uStack_1c56;
  auVar165._6_2_ = uStack_1c66;
  auVar165._10_2_ = uStack_1c64;
  auVar165._8_2_ = uStack_1c54;
  auVar165._12_2_ = uStack_1c52;
  auVar165._14_2_ = uStack_1c62;
  auVar164._8_8_ = CONCAT44(uVar160,uVar160);
  auVar164._0_8_ = CONCAT44(uVar160,uVar160);
  auVar164 = pmaddwd(auVar165,auVar164);
  auVar163._2_2_ = uStack_1ac0;
  auVar163._0_2_ = uStack_1ab0;
  auVar163._4_2_ = uStack_1aae;
  auVar163._6_2_ = uStack_1abe;
  auVar163._10_2_ = uStack_1abc;
  auVar163._8_2_ = uStack_1aac;
  auVar163._12_2_ = uStack_1aaa;
  auVar163._14_2_ = uStack_1aba;
  auVar162._8_8_ = CONCAT44(uVar160,uVar160);
  auVar162._0_8_ = CONCAT44(uVar160,uVar160);
  auVar162 = pmaddwd(auVar163,auVar162);
  local_1238 = auVar168._0_4_;
  iStack_1234 = auVar168._4_4_;
  iStack_1230 = auVar168._8_4_;
  iStack_122c = auVar168._12_4_;
  local_1258 = auVar166._0_4_;
  iStack_1254 = auVar166._4_4_;
  iStack_1250 = auVar166._8_4_;
  iStack_124c = auVar166._12_4_;
  local_1278 = auVar164._0_4_;
  iStack_1274 = auVar164._4_4_;
  iStack_1270 = auVar164._8_4_;
  iStack_126c = auVar164._12_4_;
  local_1298 = auVar162._0_4_;
  iStack_1294 = auVar162._4_4_;
  iStack_1290 = auVar162._8_4_;
  iStack_128c = auVar162._12_4_;
  auVar162 = ZEXT416((uint)(int)in_DL);
  auVar163 = ZEXT416((uint)(int)in_DL);
  auVar164 = ZEXT416((uint)(int)in_DL);
  auVar165 = ZEXT416((uint)(int)in_DL);
  auVar88._4_4_ = iStack_1234 + iVar145 >> auVar162;
  auVar88._0_4_ = local_1238 + iVar145 >> auVar162;
  auVar88._12_4_ = iStack_122c + iVar145 >> auVar162;
  auVar88._8_4_ = iStack_1230 + iVar145 >> auVar162;
  auVar87._4_4_ = iStack_1254 + iVar145 >> auVar163;
  auVar87._0_4_ = local_1258 + iVar145 >> auVar163;
  auVar87._12_4_ = iStack_124c + iVar145 >> auVar163;
  auVar87._8_4_ = iStack_1250 + iVar145 >> auVar163;
  auVar162 = packssdw(auVar88,auVar87);
  auVar86._4_4_ = iStack_1274 + iVar145 >> auVar164;
  auVar86._0_4_ = local_1278 + iVar145 >> auVar164;
  auVar86._12_4_ = iStack_126c + iVar145 >> auVar164;
  auVar86._8_4_ = iStack_1270 + iVar145 >> auVar164;
  auVar85._4_4_ = iStack_1294 + iVar145 >> auVar165;
  auVar85._0_4_ = local_1298 + iVar145 >> auVar165;
  auVar85._12_4_ = iStack_128c + iVar145 >> auVar165;
  auVar85._8_4_ = iStack_1290 + iVar145 >> auVar165;
  auVar163 = packssdw(auVar86,auVar85);
  *in_RSI = local_2aa8;
  in_RSI[1] = uStack_2aa0;
  local_3168 = auVar180._0_8_;
  uStack_3160 = auVar180._8_8_;
  in_RSI[2] = local_3168;
  in_RSI[3] = uStack_3160;
  in_RSI[4] = local_2ee8;
  in_RSI[5] = uStack_2ee0;
  local_3128 = auVar163._0_8_;
  uStack_3120 = auVar163._8_8_;
  in_RSI[6] = local_3128;
  in_RSI[7] = uStack_3120;
  in_RSI[8] = local_2a88;
  in_RSI[9] = uStack_2a80;
  local_3148 = auVar170._0_8_;
  uStack_3140 = auVar170._8_8_;
  in_RSI[10] = local_3148;
  in_RSI[0xb] = uStack_3140;
  in_RSI[0xc] = local_2ec8;
  in_RSI[0xd] = uStack_2ec0;
  local_3108 = auVar179._0_8_;
  uStack_3100 = auVar179._8_8_;
  in_RSI[0xe] = local_3108;
  in_RSI[0xf] = uStack_3100;
  in_RSI[0x10] = local_2a98;
  in_RSI[0x11] = uStack_2a90;
  local_3158 = auVar178._0_8_;
  uStack_3150 = auVar178._8_8_;
  in_RSI[0x12] = local_3158;
  in_RSI[0x13] = uStack_3150;
  in_RSI[0x14] = local_2ed8;
  in_RSI[0x15] = uStack_2ed0;
  local_3118 = auVar171._0_8_;
  uStack_3110 = auVar171._8_8_;
  in_RSI[0x16] = local_3118;
  in_RSI[0x17] = uStack_3110;
  in_RSI[0x18] = local_2a78;
  in_RSI[0x19] = uStack_2a70;
  local_3138 = auVar162._0_8_;
  uStack_3130 = auVar162._8_8_;
  in_RSI[0x1a] = local_3138;
  in_RSI[0x1b] = uStack_3130;
  in_RSI[0x1c] = local_2eb8;
  in_RSI[0x1d] = uStack_2eb0;
  local_30f8 = auVar181._0_8_;
  uStack_30f0 = auVar181._8_8_;
  in_RSI[0x1e] = local_30f8;
  in_RSI[0x1f] = uStack_30f0;
  return;
}

Assistant:

static void fdct8x16_new_sse2(const __m128i *input, __m128i *output,
                              int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m128i __rounding = _mm_set1_epi32(1 << (cos_bit - 1));

  __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);
  __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  __m128i cospi_p56_p08 = pair_set_epi16(cospi[56], cospi[8]);
  __m128i cospi_m08_p56 = pair_set_epi16(-cospi[8], cospi[56]);
  __m128i cospi_p24_p40 = pair_set_epi16(cospi[24], cospi[40]);
  __m128i cospi_m40_p24 = pair_set_epi16(-cospi[40], cospi[24]);
  __m128i cospi_p60_p04 = pair_set_epi16(cospi[60], cospi[4]);
  __m128i cospi_m04_p60 = pair_set_epi16(-cospi[4], cospi[60]);
  __m128i cospi_p28_p36 = pair_set_epi16(cospi[28], cospi[36]);
  __m128i cospi_m36_p28 = pair_set_epi16(-cospi[36], cospi[28]);
  __m128i cospi_p44_p20 = pair_set_epi16(cospi[44], cospi[20]);
  __m128i cospi_m20_p44 = pair_set_epi16(-cospi[20], cospi[44]);
  __m128i cospi_p12_p52 = pair_set_epi16(cospi[12], cospi[52]);
  __m128i cospi_m52_p12 = pair_set_epi16(-cospi[52], cospi[12]);

  // stage 1
  __m128i x1[16];
  x1[0] = _mm_adds_epi16(input[0], input[15]);
  x1[15] = _mm_subs_epi16(input[0], input[15]);
  x1[1] = _mm_adds_epi16(input[1], input[14]);
  x1[14] = _mm_subs_epi16(input[1], input[14]);
  x1[2] = _mm_adds_epi16(input[2], input[13]);
  x1[13] = _mm_subs_epi16(input[2], input[13]);
  x1[3] = _mm_adds_epi16(input[3], input[12]);
  x1[12] = _mm_subs_epi16(input[3], input[12]);
  x1[4] = _mm_adds_epi16(input[4], input[11]);
  x1[11] = _mm_subs_epi16(input[4], input[11]);
  x1[5] = _mm_adds_epi16(input[5], input[10]);
  x1[10] = _mm_subs_epi16(input[5], input[10]);
  x1[6] = _mm_adds_epi16(input[6], input[9]);
  x1[9] = _mm_subs_epi16(input[6], input[9]);
  x1[7] = _mm_adds_epi16(input[7], input[8]);
  x1[8] = _mm_subs_epi16(input[7], input[8]);

  // stage 2
  __m128i x2[16];
  x2[0] = _mm_adds_epi16(x1[0], x1[7]);
  x2[7] = _mm_subs_epi16(x1[0], x1[7]);
  x2[1] = _mm_adds_epi16(x1[1], x1[6]);
  x2[6] = _mm_subs_epi16(x1[1], x1[6]);
  x2[2] = _mm_adds_epi16(x1[2], x1[5]);
  x2[5] = _mm_subs_epi16(x1[2], x1[5]);
  x2[3] = _mm_adds_epi16(x1[3], x1[4]);
  x2[4] = _mm_subs_epi16(x1[3], x1[4]);
  x2[8] = x1[8];
  x2[9] = x1[9];
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x1[10], x1[13], x2[10], x2[13]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x1[11], x1[12], x2[11], x2[12]);
  x2[14] = x1[14];
  x2[15] = x1[15];

  // stage 3
  __m128i x3[16];
  x3[0] = _mm_adds_epi16(x2[0], x2[3]);
  x3[3] = _mm_subs_epi16(x2[0], x2[3]);
  x3[1] = _mm_adds_epi16(x2[1], x2[2]);
  x3[2] = _mm_subs_epi16(x2[1], x2[2]);
  x3[4] = x2[4];
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x2[5], x2[6], x3[5], x3[6]);
  x3[7] = x2[7];
  x3[8] = _mm_adds_epi16(x2[8], x2[11]);
  x3[11] = _mm_subs_epi16(x2[8], x2[11]);
  x3[9] = _mm_adds_epi16(x2[9], x2[10]);
  x3[10] = _mm_subs_epi16(x2[9], x2[10]);
  x3[12] = _mm_subs_epi16(x2[15], x2[12]);
  x3[15] = _mm_adds_epi16(x2[15], x2[12]);
  x3[13] = _mm_subs_epi16(x2[14], x2[13]);
  x3[14] = _mm_adds_epi16(x2[14], x2[13]);

  // stage 4
  __m128i x4[16];
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x3[0], x3[1], x4[0], x4[1]);
  btf_16_sse2(cospi_p48_p16, cospi_m16_p48, x3[2], x3[3], x4[2], x4[3]);
  x4[4] = _mm_adds_epi16(x3[4], x3[5]);
  x4[5] = _mm_subs_epi16(x3[4], x3[5]);
  x4[6] = _mm_subs_epi16(x3[7], x3[6]);
  x4[7] = _mm_adds_epi16(x3[7], x3[6]);
  x4[8] = x3[8];
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x3[9], x3[14], x4[9], x4[14]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x3[10], x3[13], x4[10], x4[13]);
  x4[11] = x3[11];
  x4[12] = x3[12];
  x4[15] = x3[15];

  // stage 5
  __m128i x5[16];
  x5[0] = x4[0];
  x5[1] = x4[1];
  x5[2] = x4[2];
  x5[3] = x4[3];
  btf_16_sse2(cospi_p56_p08, cospi_m08_p56, x4[4], x4[7], x5[4], x5[7]);
  btf_16_sse2(cospi_p24_p40, cospi_m40_p24, x4[5], x4[6], x5[5], x5[6]);
  x5[8] = _mm_adds_epi16(x4[8], x4[9]);
  x5[9] = _mm_subs_epi16(x4[8], x4[9]);
  x5[10] = _mm_subs_epi16(x4[11], x4[10]);
  x5[11] = _mm_adds_epi16(x4[11], x4[10]);
  x5[12] = _mm_adds_epi16(x4[12], x4[13]);
  x5[13] = _mm_subs_epi16(x4[12], x4[13]);
  x5[14] = _mm_subs_epi16(x4[15], x4[14]);
  x5[15] = _mm_adds_epi16(x4[15], x4[14]);

  // stage 6
  __m128i x6[16];
  x6[0] = x5[0];
  x6[1] = x5[1];
  x6[2] = x5[2];
  x6[3] = x5[3];
  x6[4] = x5[4];
  x6[5] = x5[5];
  x6[6] = x5[6];
  x6[7] = x5[7];
  btf_16_sse2(cospi_p60_p04, cospi_m04_p60, x5[8], x5[15], x6[8], x6[15]);
  btf_16_sse2(cospi_p28_p36, cospi_m36_p28, x5[9], x5[14], x6[9], x6[14]);
  btf_16_sse2(cospi_p44_p20, cospi_m20_p44, x5[10], x5[13], x6[10], x6[13]);
  btf_16_sse2(cospi_p12_p52, cospi_m52_p12, x5[11], x5[12], x6[11], x6[12]);

  // stage 7
  output[0] = x6[0];
  output[1] = x6[8];
  output[2] = x6[4];
  output[3] = x6[12];
  output[4] = x6[2];
  output[5] = x6[10];
  output[6] = x6[6];
  output[7] = x6[14];
  output[8] = x6[1];
  output[9] = x6[9];
  output[10] = x6[5];
  output[11] = x6[13];
  output[12] = x6[3];
  output[13] = x6[11];
  output[14] = x6[7];
  output[15] = x6[15];
}